

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  uint uVar56;
  uint uVar57;
  long lVar58;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  undefined4 uVar62;
  undefined8 unaff_R13;
  ulong uVar63;
  bool bVar64;
  undefined8 uVar65;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar71 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar91;
  float fVar116;
  float fVar117;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar107 [32];
  float fVar118;
  float fVar122;
  float fVar123;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar160;
  float fVar161;
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar155 [32];
  float fVar162;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar196;
  float fVar197;
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 ai_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar243;
  undefined1 auVar244 [32];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  vboolx_conflict valid1;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid0;
  StackEntry stack [3];
  int local_aec;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  RTCFilterFunctionNArguments local_a58;
  int local_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_8f0;
  float local_8e8;
  float local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint local_8d0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  Primitive *local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar63 = (ulong)(byte)PVar3;
  fVar91 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar9 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                      *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar202._0_4_ = fVar91 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar202._4_4_ = fVar91 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar202._8_4_ = fVar91 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar202._12_4_ = fVar91 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar66._0_4_ = fVar91 * auVar9._0_4_;
  auVar66._4_4_ = fVar91 * auVar9._4_4_;
  auVar66._8_4_ = fVar91 * auVar9._8_4_;
  auVar66._12_4_ = fVar91 * auVar9._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xc + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xd + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x12 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x13 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x14 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar252._4_4_ = auVar202._0_4_;
  auVar252._0_4_ = auVar202._0_4_;
  auVar252._8_4_ = auVar202._0_4_;
  auVar252._12_4_ = auVar202._0_4_;
  auVar125 = vshufps_avx(auVar202,auVar202,0x55);
  auVar67 = vshufps_avx(auVar202,auVar202,0xaa);
  fVar91 = auVar67._0_4_;
  auVar228._0_4_ = fVar91 * auVar8._0_4_;
  fVar116 = auVar67._4_4_;
  auVar228._4_4_ = fVar116 * auVar8._4_4_;
  fVar117 = auVar67._8_4_;
  auVar228._8_4_ = fVar117 * auVar8._8_4_;
  fVar118 = auVar67._12_4_;
  auVar228._12_4_ = fVar118 * auVar8._12_4_;
  auVar223._0_4_ = auVar73._0_4_ * fVar91;
  auVar223._4_4_ = auVar73._4_4_ * fVar116;
  auVar223._8_4_ = auVar73._8_4_ * fVar117;
  auVar223._12_4_ = auVar73._12_4_ * fVar118;
  auVar220._0_4_ = auVar93._0_4_ * fVar91;
  auVar220._4_4_ = auVar93._4_4_ * fVar116;
  auVar220._8_4_ = auVar93._8_4_ * fVar117;
  auVar220._12_4_ = auVar93._12_4_ * fVar118;
  auVar67 = vfmadd231ps_fma(auVar228,auVar125,auVar9);
  auVar94 = vfmadd231ps_fma(auVar223,auVar125,auVar189);
  auVar125 = vfmadd231ps_fma(auVar220,auVar68,auVar125);
  auVar140 = vfmadd231ps_fma(auVar67,auVar252,auVar7);
  auVar94 = vfmadd231ps_fma(auVar94,auVar252,auVar168);
  auVar166 = vfmadd231ps_fma(auVar125,auVar69,auVar252);
  auVar253._4_4_ = auVar66._0_4_;
  auVar253._0_4_ = auVar66._0_4_;
  auVar253._8_4_ = auVar66._0_4_;
  auVar253._12_4_ = auVar66._0_4_;
  auVar125 = vshufps_avx(auVar66,auVar66,0x55);
  auVar67 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar91 = auVar67._0_4_;
  auVar203._0_4_ = fVar91 * auVar8._0_4_;
  fVar116 = auVar67._4_4_;
  auVar203._4_4_ = fVar116 * auVar8._4_4_;
  fVar117 = auVar67._8_4_;
  auVar203._8_4_ = fVar117 * auVar8._8_4_;
  fVar118 = auVar67._12_4_;
  auVar203._12_4_ = fVar118 * auVar8._12_4_;
  auVar92._0_4_ = auVar73._0_4_ * fVar91;
  auVar92._4_4_ = auVar73._4_4_ * fVar116;
  auVar92._8_4_ = auVar73._8_4_ * fVar117;
  auVar92._12_4_ = auVar73._12_4_ * fVar118;
  auVar67._0_4_ = auVar93._0_4_ * fVar91;
  auVar67._4_4_ = auVar93._4_4_ * fVar116;
  auVar67._8_4_ = auVar93._8_4_ * fVar117;
  auVar67._12_4_ = auVar93._12_4_ * fVar118;
  auVar9 = vfmadd231ps_fma(auVar203,auVar125,auVar9);
  auVar8 = vfmadd231ps_fma(auVar92,auVar125,auVar189);
  auVar189 = vfmadd231ps_fma(auVar67,auVar125,auVar68);
  auVar68 = vfmadd231ps_fma(auVar9,auVar253,auVar7);
  auVar93 = vfmadd231ps_fma(auVar8,auVar253,auVar168);
  local_9d0._8_4_ = 0x7fffffff;
  local_9d0._0_8_ = 0x7fffffff7fffffff;
  local_9d0._12_4_ = 0x7fffffff;
  auVar237 = ZEXT1664(local_9d0);
  auVar7 = vandps_avx(auVar140,local_9d0);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar213,1);
  auVar9 = vblendvps_avx(auVar140,auVar213,auVar7);
  auVar7 = vandps_avx(auVar94,local_9d0);
  auVar7 = vcmpps_avx(auVar7,auVar213,1);
  auVar8 = vblendvps_avx(auVar94,auVar213,auVar7);
  auVar7 = vandps_avx(auVar166,local_9d0);
  auVar7 = vcmpps_avx(auVar7,auVar213,1);
  auVar7 = vblendvps_avx(auVar166,auVar213,auVar7);
  auVar125 = vfmadd231ps_fma(auVar189,auVar253,auVar69);
  auVar168 = vrcpps_avx(auVar9);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar168,auVar214);
  auVar168 = vfmadd132ps_fma(auVar9,auVar168,auVar168);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar214);
  auVar73 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar9,auVar214);
  auVar69 = vfmadd132ps_fma(auVar7,auVar9,auVar9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar68);
  auVar166._0_4_ = auVar168._0_4_ * auVar7._0_4_;
  auVar166._4_4_ = auVar168._4_4_ * auVar7._4_4_;
  auVar166._8_4_ = auVar168._8_4_ * auVar7._8_4_;
  auVar166._12_4_ = auVar168._12_4_ * auVar7._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar9);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar68);
  auVar185._0_4_ = auVar168._0_4_ * auVar7._0_4_;
  auVar185._4_4_ = auVar168._4_4_ * auVar7._4_4_;
  auVar185._8_4_ = auVar168._8_4_ * auVar7._8_4_;
  auVar185._12_4_ = auVar168._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar63 * 0xe + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar93);
  auVar204._0_4_ = auVar73._0_4_ * auVar7._0_4_;
  auVar204._4_4_ = auVar73._4_4_ * auVar7._4_4_;
  auVar204._8_4_ = auVar73._8_4_ * auVar7._8_4_;
  auVar204._12_4_ = auVar73._12_4_ * auVar7._12_4_;
  auVar94._1_3_ = 0;
  auVar94[0] = PVar3;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar7 = vpmovsxwd_avx(auVar168);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar9 = vsubps_avx(auVar7,auVar93);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar63 * 0x15 + 6);
  auVar7 = vpmovsxwd_avx(auVar189);
  auVar93._0_4_ = auVar73._0_4_ * auVar9._0_4_;
  auVar93._4_4_ = auVar73._4_4_ * auVar9._4_4_;
  auVar93._8_4_ = auVar73._8_4_ * auVar9._8_4_;
  auVar93._12_4_ = auVar73._12_4_ * auVar9._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar125);
  auVar140._0_4_ = auVar69._0_4_ * auVar7._0_4_;
  auVar140._4_4_ = auVar69._4_4_ * auVar7._4_4_;
  auVar140._8_4_ = auVar69._8_4_ * auVar7._8_4_;
  auVar140._12_4_ = auVar69._12_4_ * auVar7._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar73);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar125);
  auVar68._0_4_ = auVar69._0_4_ * auVar7._0_4_;
  auVar68._4_4_ = auVar69._4_4_ * auVar7._4_4_;
  auVar68._8_4_ = auVar69._8_4_ * auVar7._8_4_;
  auVar68._12_4_ = auVar69._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar166,auVar185);
  auVar9 = vpminsd_avx(auVar204,auVar93);
  auVar7 = vmaxps_avx(auVar7,auVar9);
  auVar9 = vpminsd_avx(auVar140,auVar68);
  uVar62 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar224._4_4_ = uVar62;
  auVar224._0_4_ = uVar62;
  auVar224._8_4_ = uVar62;
  auVar224._12_4_ = uVar62;
  auVar9 = vmaxps_avx(auVar9,auVar224);
  auVar7 = vmaxps_avx(auVar7,auVar9);
  local_4e0._0_4_ = auVar7._0_4_ * 0.99999964;
  local_4e0._4_4_ = auVar7._4_4_ * 0.99999964;
  local_4e0._8_4_ = auVar7._8_4_ * 0.99999964;
  local_4e0._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar166,auVar185);
  auVar9 = vpmaxsd_avx(auVar204,auVar93);
  auVar7 = vminps_avx(auVar7,auVar9);
  auVar9 = vpmaxsd_avx(auVar140,auVar68);
  fVar91 = (ray->super_RayK<1>).tfar;
  auVar125._4_4_ = fVar91;
  auVar125._0_4_ = fVar91;
  auVar125._8_4_ = fVar91;
  auVar125._12_4_ = fVar91;
  auVar9 = vminps_avx(auVar9,auVar125);
  auVar7 = vminps_avx(auVar7,auVar9);
  auVar69._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar94[4] = PVar3;
  auVar94._5_3_ = 0;
  auVar94[8] = PVar3;
  auVar94._9_3_ = 0;
  auVar94[0xc] = PVar3;
  auVar94._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar94,_DAT_01f4ad30);
  auVar7 = vcmpps_avx(local_4e0,auVar69,2);
  auVar7 = vandps_avx(auVar7,auVar9);
  uVar62 = vmovmskps_avx(auVar7);
  uVar63 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar62);
  auVar80._16_16_ = mm_lookupmask_ps._240_16_;
  auVar80._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar80,ZEXT832(0) << 0x20,0x80);
  local_768 = prim;
LAB_0118d35c:
  if (uVar63 == 0) {
    return;
  }
  lVar58 = 0;
  for (uVar60 = uVar63; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar57 = *(uint *)(local_768 + 2);
  pGVar4 = (context->scene->geometries).items[uVar57].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(local_768 + lVar58 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar6 = *(long *)&pGVar4[1].time_range.upper;
  auVar7 = *(undefined1 (*) [16])(lVar6 + (long)p_Var5 * uVar60);
  auVar9 = *(undefined1 (*) [16])(lVar6 + (uVar60 + 1) * (long)p_Var5);
  auVar8 = *(undefined1 (*) [16])(lVar6 + (uVar60 + 2) * (long)p_Var5);
  uVar63 = uVar63 - 1 & uVar63;
  auVar168 = *(undefined1 (*) [16])(lVar6 + (uVar60 + 3) * (long)p_Var5);
  if (uVar63 != 0) {
    uVar61 = uVar63 - 1 & uVar63;
    for (uVar60 = uVar63; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar61 != 0) {
      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar186._0_4_ = (auVar7._0_4_ + auVar9._0_4_ + auVar8._0_4_ + auVar168._0_4_) * 0.25;
  auVar186._4_4_ = (auVar7._4_4_ + auVar9._4_4_ + auVar8._4_4_ + auVar168._4_4_) * 0.25;
  auVar186._8_4_ = (auVar7._8_4_ + auVar9._8_4_ + auVar8._8_4_ + auVar168._8_4_) * 0.25;
  auVar186._12_4_ = (auVar7._12_4_ + auVar9._12_4_ + auVar8._12_4_ + auVar168._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar189 = vsubps_avx(auVar186,(undefined1  [16])aVar1);
  auVar189 = vdpps_avx(auVar189,(undefined1  [16])aVar2,0x7f);
  auVar73 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar69 = vrcpss_avx(auVar73,auVar73);
  auVar73 = vfnmadd213ss_fma(auVar69,auVar73,ZEXT416(0x40000000));
  fVar91 = auVar189._0_4_ * auVar69._0_4_ * auVar73._0_4_;
  local_780 = ZEXT416((uint)fVar91);
  auVar187._4_4_ = fVar91;
  auVar187._0_4_ = fVar91;
  auVar187._8_4_ = fVar91;
  auVar187._12_4_ = fVar91;
  fStack_610 = fVar91;
  _local_620 = auVar187;
  fStack_60c = fVar91;
  fStack_608 = fVar91;
  fStack_604 = fVar91;
  auVar189 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar187);
  auVar189 = vblendps_avx(auVar189,_DAT_01f45a50,8);
  local_990 = vsubps_avx(auVar7,auVar189);
  local_9a0 = vsubps_avx(auVar8,auVar189);
  local_9b0 = vsubps_avx(auVar9,auVar189);
  _local_9c0 = vsubps_avx(auVar168,auVar189);
  auVar7 = vmovshdup_avx(local_990);
  local_1e0 = auVar7._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar7 = vshufps_avx(local_990,local_990,0xaa);
  uVar65 = auVar7._0_8_;
  auVar174._8_8_ = uVar65;
  auVar174._0_8_ = uVar65;
  auVar174._16_8_ = uVar65;
  auVar174._24_8_ = uVar65;
  auVar7 = vshufps_avx(local_990,local_990,0xff);
  uVar65 = auVar7._0_8_;
  local_860._8_8_ = uVar65;
  local_860._0_8_ = uVar65;
  local_860._16_8_ = uVar65;
  local_860._24_8_ = uVar65;
  auVar222 = ZEXT3264(local_860);
  auVar7 = vmovshdup_avx(local_9b0);
  uVar65 = auVar7._0_8_;
  local_880._8_8_ = uVar65;
  local_880._0_8_ = uVar65;
  local_880._16_8_ = uVar65;
  local_880._24_8_ = uVar65;
  auVar242 = ZEXT3264(local_880);
  auVar7 = vshufps_avx(local_9b0,local_9b0,0xaa);
  uVar65 = auVar7._0_8_;
  local_8a0._8_8_ = uVar65;
  local_8a0._0_8_ = uVar65;
  local_8a0._16_8_ = uVar65;
  local_8a0._24_8_ = uVar65;
  auVar245 = ZEXT3264(local_8a0);
  auVar9 = vshufps_avx(local_9b0,local_9b0,0xff);
  uVar65 = auVar9._0_8_;
  auVar254._8_8_ = uVar65;
  auVar254._0_8_ = uVar65;
  auVar254._16_8_ = uVar65;
  auVar254._24_8_ = uVar65;
  auVar7 = vmovshdup_avx(local_9a0);
  uVar65 = auVar7._0_8_;
  local_a00._8_8_ = uVar65;
  local_a00._0_8_ = uVar65;
  local_a00._16_8_ = uVar65;
  local_a00._24_8_ = uVar65;
  auVar259 = ZEXT3264(local_a00);
  auVar8 = vshufps_avx(local_9a0,local_9a0,0xaa);
  uVar65 = auVar8._0_8_;
  auVar226._8_8_ = uVar65;
  auVar226._0_8_ = uVar65;
  auVar226._16_8_ = uVar65;
  auVar226._24_8_ = uVar65;
  auVar7 = vshufps_avx(local_9a0,local_9a0,0xff);
  local_200 = auVar7._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vmovshdup_avx(_local_9c0);
  local_220 = auVar7._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar7 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  local_240 = auVar7._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar7 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  local_260 = auVar7._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar70._0_4_ = aVar2.x * aVar2.x;
  auVar70._4_4_ = aVar2.y * aVar2.y;
  auVar70._8_4_ = aVar2.z * aVar2.z;
  auVar70._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar7 = vshufps_avx(auVar70,auVar70,0xaa);
  uVar65 = auVar7._0_8_;
  auVar230._8_8_ = uVar65;
  auVar230._0_8_ = uVar65;
  auVar230._16_8_ = uVar65;
  auVar230._24_8_ = uVar65;
  uVar62 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_500._4_4_ = uVar62;
  local_500._0_4_ = uVar62;
  fStack_4f8 = (float)uVar62;
  fStack_4f4 = (float)uVar62;
  fStack_4f0 = (float)uVar62;
  fStack_4ec = (float)uVar62;
  fStack_4e8 = (float)uVar62;
  register0x0000121c = uVar62;
  auVar7 = vfmadd231ps_fma(auVar230,_local_500,_local_500);
  uVar62 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar62;
  local_520._0_4_ = uVar62;
  fStack_518 = (float)uVar62;
  fStack_514 = (float)uVar62;
  fStack_510 = (float)uVar62;
  fStack_50c = (float)uVar62;
  fStack_508 = (float)uVar62;
  register0x0000121c = uVar62;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_520,_local_520);
  auVar236 = ZEXT1664(auVar7);
  uVar61 = 0;
  local_aec = 1;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  uVar62 = local_990._0_4_;
  local_380._4_4_ = uVar62;
  local_380._0_4_ = uVar62;
  local_380._8_4_ = uVar62;
  local_380._12_4_ = uVar62;
  local_380._16_4_ = uVar62;
  local_380._20_4_ = uVar62;
  local_380._24_4_ = uVar62;
  local_380._28_4_ = uVar62;
  uVar62 = local_9b0._0_4_;
  local_3a0._4_4_ = uVar62;
  local_3a0._0_4_ = uVar62;
  local_3a0._8_4_ = uVar62;
  local_3a0._12_4_ = uVar62;
  local_3a0._16_4_ = uVar62;
  local_3a0._20_4_ = uVar62;
  local_3a0._24_4_ = uVar62;
  local_3a0._28_4_ = uVar62;
  local_420 = local_9a0._0_4_;
  fStack_41c = local_420;
  fStack_418 = local_420;
  fStack_414 = local_420;
  fStack_410 = local_420;
  fStack_40c = local_420;
  fStack_408 = local_420;
  fStack_404 = local_420;
  local_2a0 = local_9c0._0_4_;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_660._8_4_ = 0x7fffffff;
  local_660._0_8_ = 0x7fffffff7fffffff;
  local_660._12_4_ = 0x7fffffff;
  local_660._16_4_ = 0x7fffffff;
  local_660._20_4_ = 0x7fffffff;
  local_660._24_4_ = 0x7fffffff;
  local_660._28_4_ = 0x7fffffff;
  local_280 = ZEXT1632(auVar7);
  local_440 = vandps_avx(ZEXT1632(auVar7),local_660);
  local_4d0 = ZEXT816(0x3f80000000000000);
  local_360 = auVar174;
  uVar60 = (ulong)*(uint *)(local_768 + lVar58 * 4 + 6);
  auVar80 = auVar226;
  do {
    auVar7 = vmovshdup_avx(local_4d0);
    auVar7 = vsubps_avx(auVar7,local_4d0);
    fVar119 = auVar7._0_4_;
    fVar121 = fVar119 * 0.04761905;
    local_8c0._0_4_ = local_4d0._0_4_;
    local_8c0._4_4_ = local_8c0._0_4_;
    local_8c0._8_4_ = local_8c0._0_4_;
    local_8c0._12_4_ = local_8c0._0_4_;
    local_8c0._16_4_ = local_8c0._0_4_;
    local_8c0._20_4_ = local_8c0._0_4_;
    local_8c0._24_4_ = local_8c0._0_4_;
    local_8c0._28_4_ = local_8c0._0_4_;
    local_6a0._4_4_ = fVar119;
    local_6a0._0_4_ = fVar119;
    local_6a0._8_4_ = fVar119;
    local_6a0._12_4_ = fVar119;
    local_6a0._16_4_ = fVar119;
    local_6a0._20_4_ = fVar119;
    local_6a0._24_4_ = fVar119;
    local_6a0._28_4_ = fVar119;
    auVar7 = vfmadd231ps_fma(local_8c0,local_6a0,_DAT_01f7b040);
    auVar107._8_4_ = 0x3f800000;
    auVar107._0_8_ = 0x3f8000003f800000;
    auVar107._12_4_ = 0x3f800000;
    auVar107._16_4_ = 0x3f800000;
    auVar107._20_4_ = 0x3f800000;
    auVar107._24_4_ = 0x3f800000;
    auVar107._28_4_ = 0x3f800000;
    auVar230 = vsubps_avx(auVar107,ZEXT1632(auVar7));
    fVar91 = auVar7._0_4_;
    auVar238._0_4_ = local_3a0._0_4_ * fVar91;
    fVar116 = auVar7._4_4_;
    auVar238._4_4_ = local_3a0._4_4_ * fVar116;
    fVar117 = auVar7._8_4_;
    auVar238._8_4_ = local_3a0._8_4_ * fVar117;
    fVar118 = auVar7._12_4_;
    auVar238._12_4_ = local_3a0._12_4_ * fVar118;
    auVar238._16_4_ = local_3a0._16_4_ * 0.0;
    auVar238._20_4_ = local_3a0._20_4_ * 0.0;
    auVar238._28_36_ = auVar237._28_36_;
    auVar238._24_4_ = local_3a0._24_4_ * 0.0;
    auVar219._0_4_ = auVar242._0_4_ * fVar91;
    auVar219._4_4_ = auVar242._4_4_ * fVar116;
    auVar219._8_4_ = auVar242._8_4_ * fVar117;
    auVar219._12_4_ = auVar242._12_4_ * fVar118;
    auVar219._16_4_ = auVar242._16_4_ * 0.0;
    auVar219._20_4_ = auVar242._20_4_ * 0.0;
    auVar219._28_36_ = auVar236._28_36_;
    auVar219._24_4_ = auVar242._24_4_ * 0.0;
    auVar175._4_4_ = auVar245._4_4_ * fVar116;
    auVar175._0_4_ = auVar245._0_4_ * fVar91;
    auVar175._8_4_ = auVar245._8_4_ * fVar117;
    auVar175._12_4_ = auVar245._12_4_ * fVar118;
    auVar175._16_4_ = auVar245._16_4_ * 0.0;
    auVar175._20_4_ = auVar245._20_4_ * 0.0;
    auVar175._24_4_ = auVar245._24_4_ * 0.0;
    auVar175._28_4_ = auVar80._28_4_;
    fVar120 = auVar9._0_4_;
    fVar184 = auVar9._4_4_;
    auVar10._4_4_ = fVar184 * fVar116;
    auVar10._0_4_ = fVar120 * fVar91;
    auVar10._8_4_ = fVar120 * fVar117;
    auVar10._12_4_ = fVar184 * fVar118;
    auVar10._16_4_ = fVar120 * 0.0;
    auVar10._20_4_ = fVar184 * 0.0;
    auVar10._24_4_ = fVar120 * 0.0;
    auVar10._28_4_ = fVar119;
    auVar7 = vfmadd231ps_fma(auVar238._0_32_,auVar230,local_380);
    auVar52._8_8_ = uStack_1d8;
    auVar52._0_8_ = local_1e0;
    auVar52._16_8_ = uStack_1d0;
    auVar52._24_8_ = uStack_1c8;
    auVar168 = vfmadd231ps_fma(auVar219._0_32_,auVar230,auVar52);
    auVar189 = vfmadd231ps_fma(auVar175,auVar230,auVar174);
    auVar73 = vfmadd231ps_fma(auVar10,auVar230,auVar222._0_32_);
    auVar237._0_4_ = fVar91 * local_420;
    auVar237._4_4_ = fVar116 * fStack_41c;
    auVar237._8_4_ = fVar117 * fStack_418;
    auVar237._12_4_ = fVar118 * fStack_414;
    auVar237._16_4_ = fStack_410 * 0.0;
    auVar237._20_4_ = fStack_40c * 0.0;
    auVar237._28_36_ = auVar222._28_36_;
    auVar237._24_4_ = fStack_408 * 0.0;
    auVar11._4_4_ = auVar259._4_4_ * fVar116;
    auVar11._0_4_ = auVar259._0_4_ * fVar91;
    auVar11._8_4_ = auVar259._8_4_ * fVar117;
    auVar11._12_4_ = auVar259._12_4_ * fVar118;
    auVar11._16_4_ = auVar259._16_4_ * 0.0;
    auVar11._20_4_ = auVar259._20_4_ * 0.0;
    auVar11._24_4_ = auVar259._24_4_ * 0.0;
    auVar11._28_4_ = local_380._28_4_;
    fVar119 = auVar8._0_4_;
    fVar120 = auVar8._4_4_;
    auVar131._4_4_ = fVar120 * fVar116;
    auVar131._0_4_ = fVar119 * fVar91;
    auVar131._8_4_ = fVar119 * fVar117;
    auVar131._12_4_ = fVar120 * fVar118;
    auVar131._16_4_ = fVar119 * 0.0;
    auVar131._20_4_ = fVar120 * 0.0;
    auVar131._24_4_ = fVar119 * 0.0;
    auVar131._28_4_ = auVar174._28_4_;
    auVar51._8_8_ = uStack_1f8;
    auVar51._0_8_ = local_200;
    auVar51._16_8_ = uStack_1f0;
    auVar51._24_8_ = uStack_1e8;
    auVar54._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar116;
    auVar54._0_4_ = (float)local_200 * fVar91;
    auVar54._8_4_ = (float)uStack_1f8 * fVar117;
    auVar54._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar118;
    auVar54._16_4_ = (float)uStack_1f0 * 0.0;
    auVar54._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar54._24_4_ = (float)uStack_1e8 * 0.0;
    auVar54._28_4_ = DAT_01f7b040._28_4_;
    auVar69 = vfmadd231ps_fma(auVar237._0_32_,auVar230,local_3a0);
    auVar68 = vfmadd231ps_fma(auVar11,auVar230,auVar242._0_32_);
    auVar93 = vfmadd231ps_fma(auVar131,auVar230,auVar245._0_32_);
    auVar125 = vfmadd231ps_fma(auVar54,auVar230,auVar254);
    auVar236._0_4_ = fVar91 * local_2a0;
    auVar236._4_4_ = fVar116 * fStack_29c;
    auVar236._8_4_ = fVar117 * fStack_298;
    auVar236._12_4_ = fVar118 * fStack_294;
    auVar236._16_4_ = fStack_290 * 0.0;
    auVar236._20_4_ = fStack_28c * 0.0;
    auVar236._28_36_ = auVar245._28_36_;
    auVar236._24_4_ = fStack_288 * 0.0;
    auVar222._0_4_ = fVar91 * (float)local_220;
    auVar222._4_4_ = fVar116 * local_220._4_4_;
    auVar222._8_4_ = fVar117 * (float)uStack_218;
    auVar222._12_4_ = fVar118 * uStack_218._4_4_;
    auVar222._16_4_ = (float)uStack_210 * 0.0;
    auVar222._20_4_ = uStack_210._4_4_ * 0.0;
    auVar222._28_36_ = auVar242._28_36_;
    auVar222._24_4_ = (float)uStack_208 * 0.0;
    auVar55._28_4_ = fVar120;
    auVar55._0_28_ =
         ZEXT1628(CONCAT412(auVar69._12_4_ * fVar118,
                            CONCAT48(auVar69._8_4_ * fVar117,
                                     CONCAT44(auVar69._4_4_ * fVar116,auVar69._0_4_ * fVar91))));
    auVar7 = vfmadd231ps_fma(auVar55,auVar230,ZEXT1632(auVar7));
    auVar168 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar68._12_4_,
                                                  CONCAT48(fVar117 * auVar68._8_4_,
                                                           CONCAT44(fVar116 * auVar68._4_4_,
                                                                    fVar91 * auVar68._0_4_)))),
                               auVar230,ZEXT1632(auVar168));
    auVar189 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar93._12_4_,
                                                  CONCAT48(fVar117 * auVar93._8_4_,
                                                           CONCAT44(fVar116 * auVar93._4_4_,
                                                                    fVar91 * auVar93._0_4_)))),
                               auVar230,ZEXT1632(auVar189));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar125._12_4_,
                                                 CONCAT48(fVar117 * auVar125._8_4_,
                                                          CONCAT44(fVar116 * auVar125._4_4_,
                                                                   fVar91 * auVar125._0_4_)))),
                              auVar230,ZEXT1632(auVar73));
    auVar13._4_4_ = fVar116 * local_240._4_4_;
    auVar13._0_4_ = fVar91 * (float)local_240;
    auVar13._8_4_ = fVar117 * (float)uStack_238;
    auVar13._12_4_ = fVar118 * uStack_238._4_4_;
    auVar13._16_4_ = (float)uStack_230 * 0.0;
    auVar13._20_4_ = uStack_230._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_228 * 0.0;
    auVar13._28_4_ = local_3a0._28_4_;
    auVar48._4_4_ = fStack_41c;
    auVar48._0_4_ = local_420;
    auVar48._8_4_ = fStack_418;
    auVar48._12_4_ = fStack_414;
    auVar48._16_4_ = fStack_410;
    auVar48._20_4_ = fStack_40c;
    auVar48._24_4_ = fStack_408;
    auVar48._28_4_ = fStack_404;
    auVar67 = vfmadd231ps_fma(auVar236._0_32_,auVar230,auVar48);
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar118,
                                                 CONCAT48(auVar67._8_4_ * fVar117,
                                                          CONCAT44(auVar67._4_4_ * fVar116,
                                                                   auVar67._0_4_ * fVar91)))),
                              auVar230,ZEXT1632(auVar69));
    auVar221._0_4_ = fVar91 * (float)local_260;
    auVar221._4_4_ = fVar116 * local_260._4_4_;
    auVar221._8_4_ = fVar117 * (float)uStack_258;
    auVar221._12_4_ = fVar118 * uStack_258._4_4_;
    auVar221._16_4_ = (float)uStack_250 * 0.0;
    auVar221._20_4_ = uStack_250._4_4_ * 0.0;
    auVar221._24_4_ = (float)uStack_248 * 0.0;
    auVar221._28_4_ = 0;
    auVar67 = vfmadd231ps_fma(auVar222._0_32_,auVar230,auVar259._0_32_);
    auVar94 = vfmadd231ps_fma(auVar13,auVar230,auVar226);
    auVar140 = vfmadd231ps_fma(auVar221,auVar230,auVar51);
    auVar14._28_4_ = fVar120;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar140._12_4_ * fVar118,
                            CONCAT48(auVar140._8_4_ * fVar117,
                                     CONCAT44(auVar140._4_4_ * fVar116,auVar140._0_4_ * fVar91))));
    auVar68 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar118,
                                                 CONCAT48(auVar67._8_4_ * fVar117,
                                                          CONCAT44(auVar67._4_4_ * fVar116,
                                                                   auVar67._0_4_ * fVar91)))),
                              auVar230,ZEXT1632(auVar68));
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar94._12_4_,
                                                 CONCAT48(fVar117 * auVar94._8_4_,
                                                          CONCAT44(fVar116 * auVar94._4_4_,
                                                                   fVar91 * auVar94._0_4_)))),
                              auVar230,ZEXT1632(auVar93));
    auVar125 = vfmadd231ps_fma(auVar14,auVar230,ZEXT1632(auVar125));
    auVar242._28_36_ = auVar259._28_36_;
    auVar242._0_28_ =
         ZEXT1628(CONCAT412(auVar68._12_4_ * fVar118,
                            CONCAT48(auVar68._8_4_ * fVar117,
                                     CONCAT44(auVar68._4_4_ * fVar116,auVar68._0_4_ * fVar91))));
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * fVar118,
                                                 CONCAT48(auVar69._8_4_ * fVar117,
                                                          CONCAT44(auVar69._4_4_ * fVar116,
                                                                   auVar69._0_4_ * fVar91)))),
                              auVar230,ZEXT1632(auVar7));
    auVar94 = vfmadd231ps_fma(auVar242._0_32_,auVar230,ZEXT1632(auVar168));
    auVar140 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar118 * auVar93._12_4_,
                                                  CONCAT48(fVar117 * auVar93._8_4_,
                                                           CONCAT44(fVar116 * auVar93._4_4_,
                                                                    fVar91 * auVar93._0_4_)))),
                               auVar230,ZEXT1632(auVar189));
    auVar166 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar125._12_4_ * fVar118,
                                                  CONCAT48(auVar125._8_4_ * fVar117,
                                                           CONCAT44(auVar125._4_4_ * fVar116,
                                                                    auVar125._0_4_ * fVar91)))),
                               ZEXT1632(auVar73),auVar230);
    auVar174 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar7));
    auVar80 = vsubps_avx(ZEXT1632(auVar68),ZEXT1632(auVar168));
    auVar230 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar189));
    auVar10 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar73));
    fVar184 = fVar121 * auVar174._0_4_ * 3.0;
    fVar196 = fVar121 * auVar174._4_4_ * 3.0;
    local_680._4_4_ = fVar196;
    local_680._0_4_ = fVar184;
    fVar197 = fVar121 * auVar174._8_4_ * 3.0;
    local_680._8_4_ = fVar197;
    fVar198 = fVar121 * auVar174._12_4_ * 3.0;
    local_680._12_4_ = fVar198;
    fVar199 = fVar121 * auVar174._16_4_ * 3.0;
    local_680._16_4_ = fVar199;
    fVar200 = fVar121 * auVar174._20_4_ * 3.0;
    local_680._20_4_ = fVar200;
    fVar201 = fVar121 * auVar174._24_4_ * 3.0;
    local_680._24_4_ = fVar201;
    local_680._28_4_ = 0x40400000;
    local_960._0_4_ = fVar121 * auVar80._0_4_ * 3.0;
    local_960._4_4_ = fVar121 * auVar80._4_4_ * 3.0;
    local_960._8_4_ = fVar121 * auVar80._8_4_ * 3.0;
    local_960._12_4_ = fVar121 * auVar80._12_4_ * 3.0;
    local_960._16_4_ = fVar121 * auVar80._16_4_ * 3.0;
    local_960._20_4_ = fVar121 * auVar80._20_4_ * 3.0;
    local_960._24_4_ = fVar121 * auVar80._24_4_ * 3.0;
    local_960._28_4_ = 0;
    local_a20._0_4_ = fVar121 * auVar230._0_4_ * 3.0;
    local_a20._4_4_ = fVar121 * auVar230._4_4_ * 3.0;
    local_a20._8_4_ = fVar121 * auVar230._8_4_ * 3.0;
    local_a20._12_4_ = fVar121 * auVar230._12_4_ * 3.0;
    local_a20._16_4_ = fVar121 * auVar230._16_4_ * 3.0;
    local_a20._20_4_ = fVar121 * auVar230._20_4_ * 3.0;
    local_a20._24_4_ = fVar121 * auVar230._24_4_ * 3.0;
    local_a20._28_4_ = 0;
    fVar91 = fVar121 * auVar10._0_4_ * 3.0;
    fVar116 = fVar121 * auVar10._4_4_ * 3.0;
    auVar216._4_4_ = fVar116;
    auVar216._0_4_ = fVar91;
    fVar117 = fVar121 * auVar10._8_4_ * 3.0;
    auVar216._8_4_ = fVar117;
    fVar118 = fVar121 * auVar10._12_4_ * 3.0;
    auVar216._12_4_ = fVar118;
    fVar119 = fVar121 * auVar10._16_4_ * 3.0;
    auVar216._16_4_ = fVar119;
    fVar120 = fVar121 * auVar10._20_4_ * 3.0;
    auVar216._20_4_ = fVar120;
    fVar121 = fVar121 * auVar10._24_4_ * 3.0;
    auVar216._24_4_ = fVar121;
    auVar216._28_4_ = auVar174._28_4_;
    auVar175 = ZEXT1632(auVar67);
    local_820 = vpermps_avx2(_DAT_01fb7720,auVar175);
    _local_7a0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar94));
    local_940 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar140));
    local_5a0 = vsubps_avx(local_820,ZEXT1632(auVar67));
    local_580 = vsubps_avx(local_940,ZEXT1632(auVar140));
    local_540 = ZEXT1632(auVar140);
    fVar122 = local_580._0_4_;
    fVar123 = local_580._4_4_;
    auVar157._4_4_ = fVar123 * fVar196;
    auVar157._0_4_ = fVar122 * fVar184;
    fVar184 = local_580._8_4_;
    auVar157._8_4_ = fVar184 * fVar197;
    fVar196 = local_580._12_4_;
    auVar157._12_4_ = fVar196 * fVar198;
    fVar197 = local_580._16_4_;
    auVar157._16_4_ = fVar197 * fVar199;
    fVar198 = local_580._20_4_;
    auVar157._20_4_ = fVar198 * fVar200;
    fVar199 = local_580._24_4_;
    auVar157._24_4_ = fVar199 * fVar201;
    auVar157._28_4_ = local_940._28_4_;
    auVar7 = vfmsub231ps_fma(auVar157,local_a20,local_5a0);
    local_2c0 = vsubps_avx(_local_7a0,ZEXT1632(auVar94));
    fVar243 = local_5a0._0_4_;
    fVar246 = local_5a0._4_4_;
    auVar180._4_4_ = fVar246 * local_960._4_4_;
    auVar180._0_4_ = fVar243 * (float)local_960._0_4_;
    fVar247 = local_5a0._8_4_;
    auVar180._8_4_ = fVar247 * local_960._8_4_;
    fVar248 = local_5a0._12_4_;
    auVar180._12_4_ = fVar248 * local_960._12_4_;
    fVar249 = local_5a0._16_4_;
    auVar180._16_4_ = fVar249 * local_960._16_4_;
    fVar250 = local_5a0._20_4_;
    auVar180._20_4_ = fVar250 * local_960._20_4_;
    fVar251 = local_5a0._24_4_;
    auVar180._24_4_ = fVar251 * local_960._24_4_;
    auVar180._28_4_ = local_820._28_4_;
    auVar168 = vfmsub231ps_fma(auVar180,local_680,local_2c0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar168._12_4_ * auVar168._12_4_,
                                                CONCAT48(auVar168._8_4_ * auVar168._8_4_,
                                                         CONCAT44(auVar168._4_4_ * auVar168._4_4_,
                                                                  auVar168._0_4_ * auVar168._0_4_)))
                                     ),ZEXT1632(auVar7),ZEXT1632(auVar7));
    auVar129._0_4_ = fVar122 * fVar122;
    auVar129._4_4_ = fVar123 * fVar123;
    auVar129._8_4_ = fVar184 * fVar184;
    auVar129._12_4_ = fVar196 * fVar196;
    auVar129._16_4_ = fVar197 * fVar197;
    auVar129._20_4_ = fVar198 * fVar198;
    auVar129._24_4_ = fVar199 * fVar199;
    auVar129._28_4_ = 0;
    auVar168 = vfmadd231ps_fma(auVar129,local_2c0,local_2c0);
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),local_5a0,local_5a0);
    fVar200 = local_2c0._0_4_;
    auVar155._0_4_ = fVar200 * (float)local_a20._0_4_;
    fVar201 = local_2c0._4_4_;
    auVar155._4_4_ = fVar201 * local_a20._4_4_;
    fVar139 = local_2c0._8_4_;
    auVar155._8_4_ = fVar139 * local_a20._8_4_;
    fVar160 = local_2c0._12_4_;
    auVar155._12_4_ = fVar160 * local_a20._12_4_;
    fVar161 = local_2c0._16_4_;
    auVar155._16_4_ = fVar161 * local_a20._16_4_;
    fVar162 = local_2c0._20_4_;
    auVar155._20_4_ = fVar162 * local_a20._20_4_;
    fVar163 = local_2c0._24_4_;
    auVar155._24_4_ = fVar163 * local_a20._24_4_;
    auVar155._28_4_ = 0;
    auVar80 = vrcpps_avx(ZEXT1632(auVar168));
    auVar189 = vfmsub231ps_fma(auVar155,local_960,local_580);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar189),ZEXT1632(auVar189));
    auVar239._8_4_ = 0x3f800000;
    auVar239._0_8_ = 0x3f8000003f800000;
    auVar239._12_4_ = 0x3f800000;
    auVar239._16_4_ = 0x3f800000;
    auVar239._20_4_ = 0x3f800000;
    auVar239._24_4_ = 0x3f800000;
    auVar239._28_4_ = 0x3f800000;
    auVar7 = vfnmadd213ps_fma(auVar80,ZEXT1632(auVar168),auVar239);
    auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar80,auVar80);
    local_840 = vpermps_avx2(_DAT_01fb7720,local_680);
    local_980 = vpermps_avx2(_DAT_01fb7720,local_a20);
    auVar130._4_4_ = local_840._4_4_ * fVar123;
    auVar130._0_4_ = local_840._0_4_ * fVar122;
    auVar130._8_4_ = local_840._8_4_ * fVar184;
    auVar130._12_4_ = local_840._12_4_ * fVar196;
    auVar130._16_4_ = local_840._16_4_ * fVar197;
    auVar130._20_4_ = local_840._20_4_ * fVar198;
    auVar130._24_4_ = local_840._24_4_ * fVar199;
    auVar130._28_4_ = auVar80._28_4_;
    auVar73 = vfmsub231ps_fma(auVar130,local_980,local_5a0);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,local_960);
    auVar15._4_4_ = fVar246 * local_7c0._4_4_;
    auVar15._0_4_ = fVar243 * local_7c0._0_4_;
    auVar15._8_4_ = fVar247 * local_7c0._8_4_;
    auVar15._12_4_ = fVar248 * local_7c0._12_4_;
    auVar15._16_4_ = fVar249 * local_7c0._16_4_;
    auVar15._20_4_ = fVar250 * local_7c0._20_4_;
    auVar15._24_4_ = fVar251 * local_7c0._24_4_;
    auVar15._28_4_ = 0x40400000;
    auVar69 = vfmsub231ps_fma(auVar15,local_840,local_2c0);
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * auVar69._12_4_,
                                                 CONCAT48(auVar69._8_4_ * auVar69._8_4_,
                                                          CONCAT44(auVar69._4_4_ * auVar69._4_4_,
                                                                   auVar69._0_4_ * auVar69._0_4_))))
                              ,ZEXT1632(auVar73),ZEXT1632(auVar73));
    auVar13 = local_980;
    auVar176._0_4_ = fVar200 * local_980._0_4_;
    auVar176._4_4_ = fVar201 * local_980._4_4_;
    auVar176._8_4_ = fVar139 * local_980._8_4_;
    auVar176._12_4_ = fVar160 * local_980._12_4_;
    auVar176._16_4_ = fVar161 * local_980._16_4_;
    auVar176._20_4_ = fVar162 * local_980._20_4_;
    auVar176._24_4_ = fVar163 * local_980._24_4_;
    auVar176._28_4_ = 0;
    auVar14 = local_7c0;
    auVar69 = vfmsub231ps_fma(auVar176,local_7c0,local_580);
    auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),ZEXT1632(auVar69),ZEXT1632(auVar69));
    auVar80 = vmaxps_avx(ZEXT1632(CONCAT412(auVar189._12_4_ * auVar7._12_4_,
                                            CONCAT48(auVar189._8_4_ * auVar7._8_4_,
                                                     CONCAT44(auVar189._4_4_ * auVar7._4_4_,
                                                              auVar189._0_4_ * auVar7._0_4_)))),
                         ZEXT1632(CONCAT412(auVar73._12_4_ * auVar7._12_4_,
                                            CONCAT48(auVar73._8_4_ * auVar7._8_4_,
                                                     CONCAT44(auVar73._4_4_ * auVar7._4_4_,
                                                              auVar73._0_4_ * auVar7._0_4_)))));
    local_6e0._0_4_ = auVar166._0_4_ + fVar91;
    local_6e0._4_4_ = auVar166._4_4_ + fVar116;
    local_6e0._8_4_ = auVar166._8_4_ + fVar117;
    local_6e0._12_4_ = auVar166._12_4_ + fVar118;
    local_6e0._16_4_ = fVar119 + 0.0;
    local_6e0._20_4_ = fVar120 + 0.0;
    local_6e0._24_4_ = fVar121 + 0.0;
    local_6e0._28_4_ = auVar174._28_4_ + 0.0;
    local_6c0 = ZEXT1632(auVar166);
    auVar174 = vsubps_avx(local_6c0,auVar216);
    local_700 = vpermps_avx2(_DAT_01fb7720,auVar174);
    local_7e0 = vpermps_avx2(_DAT_01fb7720,local_6c0);
    auVar174 = vmaxps_avx(local_6c0,local_6e0);
    auVar10 = vrsqrtps_avx(ZEXT1632(auVar168));
    auVar230 = vmaxps_avx(local_700,local_7e0);
    auVar174 = vmaxps_avx(auVar174,auVar230);
    fVar91 = auVar10._0_4_;
    fVar116 = auVar10._4_4_;
    fVar117 = auVar10._8_4_;
    fVar118 = auVar10._12_4_;
    fVar121 = auVar10._16_4_;
    fVar119 = auVar10._20_4_;
    fVar120 = auVar10._24_4_;
    auVar53._4_4_ = fVar116 * fVar116 * fVar116 * auVar168._4_4_ * -0.5;
    auVar53._0_4_ = fVar91 * fVar91 * fVar91 * auVar168._0_4_ * -0.5;
    auVar53._8_4_ = fVar117 * fVar117 * fVar117 * auVar168._8_4_ * -0.5;
    auVar53._12_4_ = fVar118 * fVar118 * fVar118 * auVar168._12_4_ * -0.5;
    auVar53._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
    auVar53._20_4_ = fVar119 * fVar119 * fVar119 * -0.0;
    auVar53._24_4_ = fVar120 * fVar120 * fVar120 * -0.0;
    auVar53._28_4_ = DAT_01fb7720._28_4_;
    auVar81._8_4_ = 0x3fc00000;
    auVar81._0_8_ = 0x3fc000003fc00000;
    auVar81._12_4_ = 0x3fc00000;
    auVar81._16_4_ = 0x3fc00000;
    auVar81._20_4_ = 0x3fc00000;
    auVar81._24_4_ = 0x3fc00000;
    auVar81._28_4_ = 0x3fc00000;
    auVar7 = vfmadd231ps_fma(auVar53,auVar81,auVar10);
    fVar116 = auVar7._0_4_;
    fVar117 = auVar7._4_4_;
    auVar16._4_4_ = fVar201 * fVar117;
    auVar16._0_4_ = fVar200 * fVar116;
    fVar121 = auVar7._8_4_;
    auVar16._8_4_ = fVar139 * fVar121;
    fVar120 = auVar7._12_4_;
    auVar16._12_4_ = fVar160 * fVar120;
    auVar16._16_4_ = fVar161 * 0.0;
    auVar16._20_4_ = fVar162 * 0.0;
    auVar16._24_4_ = fVar163 * 0.0;
    auVar16._28_4_ = 0x3fc00000;
    auVar17._4_4_ = fStack_63c * fVar123 * fVar117;
    auVar17._0_4_ = local_640 * fVar122 * fVar116;
    auVar17._8_4_ = fStack_638 * fVar184 * fVar121;
    auVar17._12_4_ = fStack_634 * fVar196 * fVar120;
    auVar17._16_4_ = fStack_630 * fVar197 * 0.0;
    auVar17._20_4_ = fStack_62c * fVar198 * 0.0;
    auVar17._24_4_ = fStack_628 * fVar199 * 0.0;
    auVar17._28_4_ = local_580._28_4_;
    auVar168 = vfmadd231ps_fma(auVar17,auVar16,_local_500);
    auVar230 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar139 = auVar230._0_4_;
    fVar160 = auVar230._4_4_;
    auVar18._4_4_ = fVar160 * fVar123 * fVar117;
    auVar18._0_4_ = fVar139 * fVar122 * fVar116;
    fVar161 = auVar230._8_4_;
    auVar18._8_4_ = fVar161 * fVar184 * fVar121;
    fVar162 = auVar230._12_4_;
    auVar18._12_4_ = fVar162 * fVar196 * fVar120;
    fVar163 = auVar230._16_4_;
    auVar18._16_4_ = fVar163 * fVar197 * 0.0;
    fVar164 = auVar230._20_4_;
    auVar18._20_4_ = fVar164 * fVar198 * 0.0;
    fVar165 = auVar230._24_4_;
    auVar18._24_4_ = fVar165 * fVar199 * 0.0;
    auVar18._28_4_ = 0;
    local_560 = ZEXT1632(auVar94);
    auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_560);
    auVar189 = vfmadd231ps_fma(auVar18,auVar10,auVar16);
    local_920 = ZEXT1632(auVar7);
    auVar19._4_4_ = fVar246 * fVar117;
    auVar19._0_4_ = fVar243 * fVar116;
    auVar19._8_4_ = fVar247 * fVar121;
    auVar19._12_4_ = fVar248 * fVar120;
    auVar19._16_4_ = fVar249 * 0.0;
    auVar19._20_4_ = fVar250 * 0.0;
    auVar19._24_4_ = fVar251 * 0.0;
    auVar19._28_4_ = 0x3fc00000;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar19,_local_520);
    auVar157 = ZEXT832(0) << 0x20;
    auVar11 = vsubps_avx(auVar157,auVar175);
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar11,auVar19);
    auVar20._4_4_ = fStack_63c * fVar160;
    auVar20._0_4_ = local_640 * fVar139;
    auVar20._8_4_ = fStack_638 * fVar161;
    auVar20._12_4_ = fStack_634 * fVar162;
    auVar20._16_4_ = fStack_630 * fVar163;
    auVar20._20_4_ = fStack_62c * fVar164;
    auVar20._24_4_ = fStack_628 * fVar165;
    auVar20._28_4_ = 0x3fc00000;
    auVar189 = vfmadd231ps_fma(auVar20,_local_500,auVar10);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),_local_520,auVar11);
    fVar91 = auVar7._0_4_;
    fVar196 = auVar168._0_4_;
    fVar118 = auVar7._4_4_;
    fVar197 = auVar168._4_4_;
    fVar119 = auVar7._8_4_;
    fVar198 = auVar168._8_4_;
    fVar184 = auVar7._12_4_;
    fVar199 = auVar168._12_4_;
    auVar21._28_4_ = local_500._28_4_;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(fVar199 * fVar184,
                            CONCAT48(fVar198 * fVar119,CONCAT44(fVar197 * fVar118,fVar196 * fVar91))
                           ));
    auVar131 = vsubps_avx(ZEXT1632(auVar189),auVar21);
    auVar22._4_4_ = fVar160 * fVar160;
    auVar22._0_4_ = fVar139 * fVar139;
    auVar22._8_4_ = fVar161 * fVar161;
    auVar22._12_4_ = fVar162 * fVar162;
    auVar22._16_4_ = fVar163 * fVar163;
    auVar22._20_4_ = fVar164 * fVar164;
    auVar22._24_4_ = fVar165 * fVar165;
    auVar22._28_4_ = local_500._28_4_;
    auVar189 = vfmadd231ps_fma(auVar22,auVar10,auVar10);
    auVar189 = vfmadd231ps_fma(ZEXT1632(auVar189),auVar11,auVar11);
    auVar180 = ZEXT1632(auVar168);
    auVar23._28_4_ = local_520._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar199 * fVar199,
                            CONCAT48(fVar198 * fVar198,CONCAT44(fVar197 * fVar197,fVar196 * fVar196)
                                    )));
    _local_720 = vsubps_avx(ZEXT1632(auVar189),auVar23);
    _local_760 = vsqrtps_avx(auVar80);
    fVar123 = local_760._28_4_ + auVar174._28_4_;
    fVar196 = (local_760._0_4_ + auVar174._0_4_) * 1.0000002;
    fVar197 = (local_760._4_4_ + auVar174._4_4_) * 1.0000002;
    fVar198 = (local_760._8_4_ + auVar174._8_4_) * 1.0000002;
    fVar199 = (local_760._12_4_ + auVar174._12_4_) * 1.0000002;
    fVar200 = (local_760._16_4_ + auVar174._16_4_) * 1.0000002;
    fVar201 = (local_760._20_4_ + auVar174._20_4_) * 1.0000002;
    fVar122 = (local_760._24_4_ + auVar174._24_4_) * 1.0000002;
    auVar24._4_4_ = fVar197 * fVar197;
    auVar24._0_4_ = fVar196 * fVar196;
    auVar24._8_4_ = fVar198 * fVar198;
    auVar24._12_4_ = fVar199 * fVar199;
    auVar24._16_4_ = fVar200 * fVar200;
    auVar24._20_4_ = fVar201 * fVar201;
    auVar24._24_4_ = fVar122 * fVar122;
    auVar24._28_4_ = fVar123;
    fVar201 = auVar131._0_4_ + auVar131._0_4_;
    fVar122 = auVar131._4_4_ + auVar131._4_4_;
    local_300._0_8_ = CONCAT44(fVar122,fVar201);
    local_300._8_4_ = auVar131._8_4_ + auVar131._8_4_;
    local_300._12_4_ = auVar131._12_4_ + auVar131._12_4_;
    local_300._16_4_ = auVar131._16_4_ + auVar131._16_4_;
    local_300._20_4_ = auVar131._20_4_ + auVar131._20_4_;
    local_300._24_4_ = auVar131._24_4_ + auVar131._24_4_;
    local_300._28_4_ = auVar131._28_4_ + auVar131._28_4_;
    local_5e0 = vsubps_avx(_local_720,auVar24);
    local_2e0._28_4_ = local_840._28_4_;
    local_2e0._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar184,
                            CONCAT48(fVar119 * fVar119,CONCAT44(fVar118 * fVar118,fVar91 * fVar91)))
                 );
    auVar174 = vsubps_avx(local_280,local_2e0);
    local_740._4_4_ = fVar122 * fVar122;
    local_740._0_4_ = fVar201 * fVar201;
    local_740._8_4_ = local_300._8_4_ * local_300._8_4_;
    local_740._12_4_ = local_300._12_4_ * local_300._12_4_;
    local_740._16_4_ = local_300._16_4_ * local_300._16_4_;
    local_740._20_4_ = local_300._20_4_ * local_300._20_4_;
    local_740._24_4_ = local_300._24_4_ * local_300._24_4_;
    local_740._28_4_ = fVar123;
    fVar91 = auVar174._0_4_;
    fVar118 = fVar91 * 4.0;
    fVar184 = auVar174._4_4_;
    fVar119 = fVar184 * 4.0;
    fVar196 = auVar174._8_4_;
    fStack_7f8 = fVar196 * 4.0;
    fVar197 = auVar174._12_4_;
    fStack_7f4 = fVar197 * 4.0;
    fVar198 = auVar174._16_4_;
    fStack_7f0 = fVar198 * 4.0;
    fVar199 = auVar174._20_4_;
    fStack_7ec = fVar199 * 4.0;
    fVar200 = auVar174._24_4_;
    fStack_7e8 = fVar200 * 4.0;
    local_800 = CONCAT44(fVar119,fVar118);
    uStack_7e4 = 0x40800000;
    auVar25._4_4_ = fVar119 * local_5e0._4_4_;
    auVar25._0_4_ = fVar118 * local_5e0._0_4_;
    auVar25._8_4_ = fStack_7f8 * local_5e0._8_4_;
    auVar25._12_4_ = fStack_7f4 * local_5e0._12_4_;
    auVar25._16_4_ = fStack_7f0 * local_5e0._16_4_;
    auVar25._20_4_ = fStack_7ec * local_5e0._20_4_;
    auVar25._24_4_ = fStack_7e8 * local_5e0._24_4_;
    auVar25._28_4_ = 0x40800000;
    auVar131 = vsubps_avx(local_740,auVar25);
    auVar80 = vcmpps_avx(auVar131,auVar157,5);
    auVar237 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    local_320._0_4_ = fVar91 + fVar91;
    local_320._4_4_ = fVar184 + fVar184;
    local_320._8_4_ = fVar196 + fVar196;
    local_320._12_4_ = fVar197 + fVar197;
    local_320._16_4_ = fVar198 + fVar198;
    local_320._20_4_ = fVar199 + fVar199;
    local_320._24_4_ = fVar200 + fVar200;
    fVar91 = auVar174._28_4_;
    local_320._28_4_ = fVar91 + fVar91;
    auVar216 = ZEXT1632(auVar7);
    if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar80 >> 0x7f,0) == '\0') &&
          (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar80 >> 0xbf,0) == '\0') &&
        (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar80[0x1f]) {
      auVar108._8_4_ = 0x7f800000;
      auVar108._0_8_ = 0x7f8000007f800000;
      auVar108._12_4_ = 0x7f800000;
      auVar108._16_4_ = 0x7f800000;
      auVar108._20_4_ = 0x7f800000;
      auVar108._24_4_ = 0x7f800000;
      auVar108._28_4_ = 0x7f800000;
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
    }
    else {
      auVar130 = vsqrtps_avx(auVar131);
      local_5c0 = vcmpps_avx(auVar131,auVar157,5);
      auVar131 = vrcpps_avx(local_320);
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = 0x3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      auVar231._16_4_ = 0x3f800000;
      auVar231._20_4_ = 0x3f800000;
      auVar231._24_4_ = 0x3f800000;
      auVar231._28_4_ = 0x3f800000;
      auVar7 = vfnmadd213ps_fma(auVar131,local_320,auVar231);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar131,auVar131);
      auVar207._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
      auVar207._8_4_ = -local_300._8_4_;
      auVar207._12_4_ = -local_300._12_4_;
      auVar207._16_4_ = -local_300._16_4_;
      auVar207._20_4_ = -local_300._20_4_;
      auVar207._24_4_ = -local_300._24_4_;
      auVar207._28_4_ = -local_300._28_4_;
      auVar131 = vsubps_avx(auVar207,auVar130);
      auVar26._4_4_ = auVar7._4_4_ * auVar131._4_4_;
      auVar26._0_4_ = auVar7._0_4_ * auVar131._0_4_;
      auVar26._8_4_ = auVar7._8_4_ * auVar131._8_4_;
      auVar26._12_4_ = auVar7._12_4_ * auVar131._12_4_;
      auVar26._16_4_ = auVar131._16_4_ * 0.0;
      auVar26._20_4_ = auVar131._20_4_ * 0.0;
      auVar26._24_4_ = auVar131._24_4_ * 0.0;
      auVar26._28_4_ = local_300._28_4_;
      auVar131 = vsubps_avx(auVar130,local_300);
      auVar256._0_4_ = auVar7._0_4_ * auVar131._0_4_;
      auVar256._4_4_ = auVar7._4_4_ * auVar131._4_4_;
      auVar256._8_4_ = auVar7._8_4_ * auVar131._8_4_;
      auVar256._12_4_ = auVar7._12_4_ * auVar131._12_4_;
      auVar256._16_4_ = auVar131._16_4_ * 0.0;
      auVar256._20_4_ = auVar131._20_4_ * 0.0;
      auVar256._24_4_ = auVar131._24_4_ * 0.0;
      auVar256._28_4_ = 0;
      auVar7 = vfmadd213ps_fma(auVar216,auVar26,auVar180);
      local_3c0 = fVar116 * auVar7._0_4_;
      fStack_3bc = fVar117 * auVar7._4_4_;
      fStack_3b8 = fVar121 * auVar7._8_4_;
      fStack_3b4 = fVar120 * auVar7._12_4_;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      fStack_3a4 = fVar91;
      auVar131 = vandps_avx(local_2e0,local_660);
      auVar131 = vmaxps_avx(local_440,auVar131);
      auVar27._4_4_ = auVar131._4_4_ * 1.9073486e-06;
      auVar27._0_4_ = auVar131._0_4_ * 1.9073486e-06;
      auVar27._8_4_ = auVar131._8_4_ * 1.9073486e-06;
      auVar27._12_4_ = auVar131._12_4_ * 1.9073486e-06;
      auVar27._16_4_ = auVar131._16_4_ * 1.9073486e-06;
      auVar27._20_4_ = auVar131._20_4_ * 1.9073486e-06;
      auVar27._24_4_ = auVar131._24_4_ * 1.9073486e-06;
      auVar27._28_4_ = auVar131._28_4_;
      auVar131 = vandps_avx(auVar174,local_660);
      auVar131 = vcmpps_avx(auVar131,auVar27,1);
      auVar7 = vfmadd213ps_fma(auVar216,auVar256,auVar180);
      auVar109._8_4_ = 0x7f800000;
      auVar109._0_8_ = 0x7f8000007f800000;
      auVar109._12_4_ = 0x7f800000;
      auVar109._16_4_ = 0x7f800000;
      auVar109._20_4_ = 0x7f800000;
      auVar109._24_4_ = 0x7f800000;
      auVar109._28_4_ = 0x7f800000;
      auVar108 = vblendvps_avx(auVar109,auVar26,local_5c0);
      local_3e0 = auVar7._0_4_ * fVar116;
      fStack_3dc = auVar7._4_4_ * fVar117;
      fStack_3d8 = auVar7._8_4_ * fVar121;
      fStack_3d4 = auVar7._12_4_ * fVar120;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      fStack_3c4 = fVar91;
      auVar232._8_4_ = 0xff800000;
      auVar232._0_8_ = 0xff800000ff800000;
      auVar232._12_4_ = 0xff800000;
      auVar232._16_4_ = 0xff800000;
      auVar232._20_4_ = 0xff800000;
      auVar232._24_4_ = 0xff800000;
      auVar232._28_4_ = 0xff800000;
      auVar255 = vblendvps_avx(auVar232,auVar256,local_5c0);
      auVar157 = local_5c0 & auVar131;
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0x7f,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0xbf,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar157[0x1f] < '\0') {
        auVar80 = vandps_avx(local_5c0,auVar131);
        auVar157 = vcmpps_avx(local_5e0,_DAT_01f7b000,2);
        auVar90._8_4_ = 0xff800000;
        auVar90._0_8_ = 0xff800000ff800000;
        auVar90._12_4_ = 0xff800000;
        auVar90._16_4_ = 0xff800000;
        auVar90._20_4_ = 0xff800000;
        auVar90._24_4_ = 0xff800000;
        auVar90._28_4_ = 0xff800000;
        auVar244._8_4_ = 0x7f800000;
        auVar244._0_8_ = 0x7f8000007f800000;
        auVar244._12_4_ = 0x7f800000;
        auVar244._16_4_ = 0x7f800000;
        auVar244._20_4_ = 0x7f800000;
        auVar244._24_4_ = 0x7f800000;
        auVar244._28_4_ = 0x7f800000;
        auVar131 = vblendvps_avx(auVar244,auVar90,auVar157);
        auVar7 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
        auVar130 = vpmovsxwd_avx2(auVar7);
        auVar108 = vblendvps_avx(auVar108,auVar131,auVar130);
        auVar131 = vblendvps_avx(auVar90,auVar244,auVar157);
        auVar237 = ZEXT3264(auVar131);
        auVar255 = vblendvps_avx(auVar255,auVar131,auVar130);
        auVar212._0_8_ = auVar80._0_8_ ^ 0xffffffffffffffff;
        auVar212._8_4_ = auVar80._8_4_ ^ 0xffffffff;
        auVar212._12_4_ = auVar80._12_4_ ^ 0xffffffff;
        auVar212._16_4_ = auVar80._16_4_ ^ 0xffffffff;
        auVar212._20_4_ = auVar80._20_4_ ^ 0xffffffff;
        auVar212._24_4_ = auVar80._24_4_ ^ 0xffffffff;
        auVar212._28_4_ = auVar80._28_4_ ^ 0xffffffff;
        auVar80 = vorps_avx(auVar157,auVar212);
        auVar80 = vandps_avx(local_5c0,auVar80);
      }
    }
    auVar131 = local_340 & auVar80;
    auVar236 = ZEXT3264(_local_500);
    local_800 = uVar60;
    if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar131 >> 0x7f,0) == '\0') &&
          (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar131 >> 0xbf,0) == '\0') &&
        (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar131[0x1f])
    {
      auVar222 = ZEXT3264(local_860);
      auVar242 = ZEXT3264(local_880);
      auVar245 = ZEXT3264(local_8a0);
      auVar259 = ZEXT3264(local_a00);
    }
    else {
      local_5e0 = auVar174;
      local_5c0 = auVar80;
      fVar91 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_780._0_4_;
      auVar82._4_4_ = fVar91;
      auVar82._0_4_ = fVar91;
      auVar82._8_4_ = fVar91;
      auVar82._12_4_ = fVar91;
      auVar82._16_4_ = fVar91;
      auVar82._20_4_ = fVar91;
      auVar82._24_4_ = fVar91;
      auVar82._28_4_ = fVar91;
      auVar131 = vmaxps_avx(auVar82,auVar108);
      fVar91 = (ray->super_RayK<1>).tfar - (float)local_780._0_4_;
      auVar110._4_4_ = fVar91;
      auVar110._0_4_ = fVar91;
      auVar110._8_4_ = fVar91;
      auVar110._12_4_ = fVar91;
      auVar110._16_4_ = fVar91;
      auVar110._20_4_ = fVar91;
      auVar110._24_4_ = fVar91;
      auVar110._28_4_ = fVar91;
      auVar157 = vminps_avx(auVar110,auVar255);
      auVar28._4_4_ = local_a20._4_4_ * fVar160;
      auVar28._0_4_ = (float)local_a20._0_4_ * fVar139;
      auVar28._8_4_ = local_a20._8_4_ * fVar161;
      auVar28._12_4_ = local_a20._12_4_ * fVar162;
      auVar28._16_4_ = local_a20._16_4_ * fVar163;
      auVar28._20_4_ = local_a20._20_4_ * fVar164;
      auVar28._24_4_ = local_a20._24_4_ * fVar165;
      auVar28._28_4_ = fVar91;
      auVar7 = vfmadd213ps_fma(auVar10,local_960,auVar28);
      auVar168 = vfmadd213ps_fma(auVar11,local_680,ZEXT1632(auVar7));
      auVar29._4_4_ = local_a20._4_4_ * fStack_63c;
      auVar29._0_4_ = (float)local_a20._0_4_ * local_640;
      auVar29._8_4_ = local_a20._8_4_ * fStack_638;
      auVar29._12_4_ = local_a20._12_4_ * fStack_634;
      auVar29._16_4_ = local_a20._16_4_ * fStack_630;
      auVar29._20_4_ = local_a20._20_4_ * fStack_62c;
      auVar29._24_4_ = local_a20._24_4_ * fStack_628;
      auVar29._28_4_ = auVar230._28_4_;
      auVar7 = vfmadd231ps_fma(auVar29,_local_500,local_960);
      auVar189 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_520,local_680);
      auVar237 = ZEXT3264(local_660);
      auVar230 = vandps_avx(local_660,ZEXT1632(auVar189));
      auVar177._8_4_ = 0x219392ef;
      auVar177._0_8_ = 0x219392ef219392ef;
      auVar177._12_4_ = 0x219392ef;
      auVar177._16_4_ = 0x219392ef;
      auVar177._20_4_ = 0x219392ef;
      auVar177._24_4_ = 0x219392ef;
      auVar177._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar230,auVar177,1);
      auVar230 = vrcpps_avx(ZEXT1632(auVar189));
      auVar257._8_4_ = 0x3f800000;
      auVar257._0_8_ = 0x3f8000003f800000;
      auVar257._12_4_ = 0x3f800000;
      auVar257._16_4_ = 0x3f800000;
      auVar257._20_4_ = 0x3f800000;
      auVar257._24_4_ = 0x3f800000;
      auVar257._28_4_ = 0x3f800000;
      auVar130 = ZEXT1632(auVar189);
      auVar7 = vfnmadd213ps_fma(auVar230,auVar130,auVar257);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar230,auVar230);
      auVar233._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
      auVar233._8_4_ = auVar189._8_4_ ^ 0x80000000;
      auVar233._12_4_ = auVar189._12_4_ ^ 0x80000000;
      auVar233._16_4_ = 0x80000000;
      auVar233._20_4_ = 0x80000000;
      auVar233._24_4_ = 0x80000000;
      auVar233._28_4_ = 0x80000000;
      auVar30._4_4_ = auVar7._4_4_ * -auVar168._4_4_;
      auVar30._0_4_ = auVar7._0_4_ * -auVar168._0_4_;
      auVar30._8_4_ = auVar7._8_4_ * -auVar168._8_4_;
      auVar30._12_4_ = auVar7._12_4_ * -auVar168._12_4_;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      auVar230 = vcmpps_avx(auVar130,auVar233,1);
      auVar230 = vorps_avx(auVar10,auVar230);
      auVar240._8_4_ = 0xff800000;
      auVar240._0_8_ = 0xff800000ff800000;
      auVar240._12_4_ = 0xff800000;
      auVar240._16_4_ = 0xff800000;
      auVar240._20_4_ = 0xff800000;
      auVar240._24_4_ = 0xff800000;
      auVar240._28_4_ = 0xff800000;
      auVar230 = vblendvps_avx(auVar30,auVar240,auVar230);
      auVar11 = vmaxps_avx(auVar131,auVar230);
      auVar230 = vcmpps_avx(auVar130,auVar233,6);
      auVar230 = vorps_avx(auVar10,auVar230);
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      auVar236 = ZEXT3264(auVar234);
      auVar230 = vblendvps_avx(auVar30,auVar234,auVar230);
      auVar131 = vminps_avx(auVar157,auVar230);
      fVar91 = -local_980._0_4_;
      fVar184 = -local_980._4_4_;
      fVar196 = -local_980._8_4_;
      fVar197 = -local_980._12_4_;
      fVar198 = -local_980._16_4_;
      fVar199 = -local_980._20_4_;
      fVar200 = -local_980._24_4_;
      auVar156._0_8_ = local_7c0._0_8_ ^ 0x8000000080000000;
      auVar156._8_4_ = -local_7c0._8_4_;
      auVar156._12_4_ = -local_7c0._12_4_;
      auVar156._16_4_ = -local_7c0._16_4_;
      auVar156._20_4_ = -local_7c0._20_4_;
      auVar156._24_4_ = -local_7c0._24_4_;
      auVar156._28_4_ = local_7c0._28_4_ ^ 0x80000000;
      auVar230 = vsubps_avx(ZEXT832(0) << 0x20,_local_7a0);
      auVar10 = vsubps_avx(ZEXT832(0) << 0x20,local_940);
      auVar31._4_4_ = auVar10._4_4_ * fVar184;
      auVar31._0_4_ = auVar10._0_4_ * fVar91;
      auVar31._8_4_ = auVar10._8_4_ * fVar196;
      auVar31._12_4_ = auVar10._12_4_ * fVar197;
      auVar31._16_4_ = auVar10._16_4_ * fVar198;
      auVar31._20_4_ = auVar10._20_4_ * fVar199;
      auVar31._24_4_ = auVar10._24_4_ * fVar200;
      auVar31._28_4_ = auVar10._28_4_;
      auVar7 = vfmadd231ps_fma(auVar31,auVar156,auVar230);
      auVar178._0_8_ = local_840._0_8_ ^ 0x8000000080000000;
      auVar178._8_4_ = -local_840._8_4_;
      auVar178._12_4_ = -local_840._12_4_;
      auVar178._16_4_ = -local_840._16_4_;
      auVar178._20_4_ = -local_840._20_4_;
      auVar178._24_4_ = -local_840._24_4_;
      auVar178._28_4_ = local_840._28_4_ ^ 0x80000000;
      auVar230 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar178,auVar230);
      auVar32._4_4_ = fVar184 * fStack_63c;
      auVar32._0_4_ = fVar91 * local_640;
      auVar32._8_4_ = fVar196 * fStack_638;
      auVar32._12_4_ = fVar197 * fStack_634;
      auVar32._16_4_ = fVar198 * fStack_630;
      auVar32._20_4_ = fVar199 * fStack_62c;
      auVar32._24_4_ = fVar200 * fStack_628;
      auVar32._28_4_ = local_980._28_4_ ^ 0x80000000;
      auVar7 = vfmadd231ps_fma(auVar32,_local_500,auVar156);
      auVar189 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_520,auVar178);
      auVar230 = vandps_avx(local_660,ZEXT1632(auVar189));
      auVar157 = vrcpps_avx(ZEXT1632(auVar189));
      auVar208._8_4_ = 0x219392ef;
      auVar208._0_8_ = 0x219392ef219392ef;
      auVar208._12_4_ = 0x219392ef;
      auVar208._16_4_ = 0x219392ef;
      auVar208._20_4_ = 0x219392ef;
      auVar208._24_4_ = 0x219392ef;
      auVar208._28_4_ = 0x219392ef;
      auVar10 = vcmpps_avx(auVar230,auVar208,1);
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = 0x3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar130 = ZEXT1632(auVar189);
      auVar7 = vfnmadd213ps_fma(auVar157,auVar130,auVar227);
      auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar157,auVar157);
      auVar179._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
      auVar179._8_4_ = auVar189._8_4_ ^ 0x80000000;
      auVar179._12_4_ = auVar189._12_4_ ^ 0x80000000;
      auVar179._16_4_ = 0x80000000;
      auVar179._20_4_ = 0x80000000;
      auVar179._24_4_ = 0x80000000;
      auVar179._28_4_ = 0x80000000;
      auVar33._4_4_ = auVar7._4_4_ * -auVar168._4_4_;
      auVar33._0_4_ = auVar7._0_4_ * -auVar168._0_4_;
      auVar33._8_4_ = auVar7._8_4_ * -auVar168._8_4_;
      auVar33._12_4_ = auVar7._12_4_ * -auVar168._12_4_;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar230 = vcmpps_avx(auVar130,auVar179,1);
      auVar230 = vorps_avx(auVar10,auVar230);
      auVar230 = vblendvps_avx(auVar33,auVar240,auVar230);
      local_480 = vmaxps_avx(auVar11,auVar230);
      auVar230 = vcmpps_avx(auVar130,auVar179,6);
      auVar230 = vorps_avx(auVar10,auVar230);
      auVar230 = vblendvps_avx(auVar33,auVar234,auVar230);
      auVar80 = vandps_avx(local_340,auVar80);
      local_4a0 = vminps_avx(auVar131,auVar230);
      auVar230 = vcmpps_avx(local_480,local_4a0,2);
      auVar10 = auVar80 & auVar230;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar50._4_4_ = fStack_3bc;
        auVar50._0_4_ = local_3c0;
        auVar50._8_4_ = fStack_3b8;
        auVar50._12_4_ = fStack_3b4;
        auVar50._16_4_ = uStack_3b0;
        auVar50._20_4_ = uStack_3ac;
        auVar50._24_4_ = uStack_3a8;
        auVar50._28_4_ = fStack_3a4;
        auVar209._8_4_ = 0x3f800000;
        auVar209._0_8_ = 0x3f8000003f800000;
        auVar209._12_4_ = 0x3f800000;
        auVar209._16_4_ = 0x3f800000;
        auVar209._20_4_ = 0x3f800000;
        auVar209._24_4_ = 0x3f800000;
        auVar209._28_4_ = 0x3f800000;
        auVar10 = vminps_avx(auVar50,auVar209);
        auVar131 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar10 = vmaxps_avx(auVar10,ZEXT832(0) << 0x20);
        auVar49._4_4_ = fStack_3dc;
        auVar49._0_4_ = local_3e0;
        auVar49._8_4_ = fStack_3d8;
        auVar49._12_4_ = fStack_3d4;
        auVar49._16_4_ = uStack_3d0;
        auVar49._20_4_ = uStack_3cc;
        auVar49._24_4_ = uStack_3c8;
        auVar49._28_4_ = fStack_3c4;
        auVar11 = vminps_avx(auVar49,auVar209);
        auVar11 = vmaxps_avx(auVar11,ZEXT832(0) << 0x20);
        auVar236 = ZEXT3264(_DAT_01f7b060);
        auVar34._4_4_ = (DAT_01f7b060._4_4_ + auVar10._4_4_) * 0.125;
        auVar34._0_4_ = ((float)DAT_01f7b060 + auVar10._0_4_) * 0.125;
        auVar34._8_4_ = (DAT_01f7b060._8_4_ + auVar10._8_4_) * 0.125;
        auVar34._12_4_ = (DAT_01f7b060._12_4_ + auVar10._12_4_) * 0.125;
        auVar34._16_4_ = (DAT_01f7b060._16_4_ + auVar10._16_4_) * 0.125;
        auVar34._20_4_ = (DAT_01f7b060._20_4_ + auVar10._20_4_) * 0.125;
        auVar34._24_4_ = (DAT_01f7b060._24_4_ + auVar10._24_4_) * 0.125;
        auVar34._28_4_ = DAT_01f7b060._28_4_ + auVar10._28_4_;
        auVar7 = vfmadd213ps_fma(auVar34,local_6a0,local_8c0);
        auVar35._4_4_ = (DAT_01f7b060._4_4_ + auVar11._4_4_) * 0.125;
        auVar35._0_4_ = ((float)DAT_01f7b060 + auVar11._0_4_) * 0.125;
        auVar35._8_4_ = (DAT_01f7b060._8_4_ + auVar11._8_4_) * 0.125;
        auVar35._12_4_ = (DAT_01f7b060._12_4_ + auVar11._12_4_) * 0.125;
        auVar35._16_4_ = (DAT_01f7b060._16_4_ + auVar11._16_4_) * 0.125;
        auVar35._20_4_ = (DAT_01f7b060._20_4_ + auVar11._20_4_) * 0.125;
        auVar35._24_4_ = (DAT_01f7b060._24_4_ + auVar11._24_4_) * 0.125;
        auVar35._28_4_ = DAT_01f7b060._28_4_ + auVar11._28_4_;
        auVar168 = vfmadd213ps_fma(auVar35,local_6a0,local_8c0);
        auVar10 = vminps_avx(local_6c0,local_6e0);
        auVar11 = vminps_avx(local_700,local_7e0);
        auVar10 = vminps_avx(auVar10,auVar11);
        auVar10 = vsubps_avx(auVar10,_local_760);
        auVar80 = vandps_avx(auVar230,auVar80);
        local_1a0 = ZEXT1632(auVar7);
        local_1c0 = ZEXT1632(auVar168);
        auVar36._4_4_ = auVar10._4_4_ * 0.99999976;
        auVar36._0_4_ = auVar10._0_4_ * 0.99999976;
        auVar36._8_4_ = auVar10._8_4_ * 0.99999976;
        auVar36._12_4_ = auVar10._12_4_ * 0.99999976;
        auVar36._16_4_ = auVar10._16_4_ * 0.99999976;
        auVar36._20_4_ = auVar10._20_4_ * 0.99999976;
        auVar36._24_4_ = auVar10._24_4_ * 0.99999976;
        auVar36._28_4_ = 0x3f7ffffc;
        auVar230 = vmaxps_avx(ZEXT832(0) << 0x20,auVar36);
        auVar37._4_4_ = auVar230._4_4_ * auVar230._4_4_;
        auVar37._0_4_ = auVar230._0_4_ * auVar230._0_4_;
        auVar37._8_4_ = auVar230._8_4_ * auVar230._8_4_;
        auVar37._12_4_ = auVar230._12_4_ * auVar230._12_4_;
        auVar37._16_4_ = auVar230._16_4_ * auVar230._16_4_;
        auVar37._20_4_ = auVar230._20_4_ * auVar230._20_4_;
        auVar37._24_4_ = auVar230._24_4_ * auVar230._24_4_;
        auVar37._28_4_ = auVar230._28_4_;
        auVar10 = vsubps_avx(_local_720,auVar37);
        auVar38._4_4_ = auVar10._4_4_ * fVar119;
        auVar38._0_4_ = auVar10._0_4_ * fVar118;
        auVar38._8_4_ = auVar10._8_4_ * fStack_7f8;
        auVar38._12_4_ = auVar10._12_4_ * fStack_7f4;
        auVar38._16_4_ = auVar10._16_4_ * fStack_7f0;
        auVar38._20_4_ = auVar10._20_4_ * fStack_7ec;
        auVar38._24_4_ = auVar10._24_4_ * fStack_7e8;
        auVar38._28_4_ = auVar230._28_4_;
        auVar11 = vsubps_avx(local_740,auVar38);
        auVar230 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        auVar237 = ZEXT3264(auVar230);
        if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar230 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar230 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar230 >> 0x7f,0) == '\0') &&
              (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar230 >> 0xbf,0) == '\0') &&
            (auVar230 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar230[0x1f]) {
          auVar180 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_ac0 = SUB3228(ZEXT432(0) << 0x20,0);
          local_920 = ZEXT432(0) << 0x20;
          auVar157 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_ae0 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar210._8_4_ = 0x7f800000;
          auVar210._0_8_ = 0x7f8000007f800000;
          auVar210._12_4_ = 0x7f800000;
          auVar210._16_4_ = 0x7f800000;
          auVar210._20_4_ = 0x7f800000;
          auVar210._24_4_ = 0x7f800000;
          auVar210._28_4_ = 0x7f800000;
          auVar217._8_4_ = 0xff800000;
          auVar217._0_8_ = 0xff800000ff800000;
          auVar217._12_4_ = 0xff800000;
          auVar217._16_4_ = 0xff800000;
          auVar217._20_4_ = 0xff800000;
          auVar217._24_4_ = 0xff800000;
          auVar217._28_4_ = 0xff800000;
        }
        else {
          local_820 = auVar230;
          local_7e0 = local_480;
          auVar131 = vrcpps_avx(local_320);
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar132._16_4_ = 0x3f800000;
          auVar132._20_4_ = 0x3f800000;
          auVar132._24_4_ = 0x3f800000;
          auVar132._28_4_ = 0x3f800000;
          auVar7 = vfnmadd213ps_fma(local_320,auVar131,auVar132);
          auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar131,auVar131);
          auVar131 = vsqrtps_avx(auVar11);
          auVar133._0_8_ = CONCAT44(fVar122,fVar201) ^ 0x8000000080000000;
          auVar133._8_4_ = -local_300._8_4_;
          auVar133._12_4_ = -local_300._12_4_;
          auVar133._16_4_ = -local_300._16_4_;
          auVar133._20_4_ = -local_300._20_4_;
          auVar133._24_4_ = -local_300._24_4_;
          auVar133._28_4_ = -local_300._28_4_;
          auVar157 = vsubps_avx(auVar133,auVar131);
          auVar131 = vsubps_avx(auVar131,local_300);
          auVar193._0_4_ = auVar157._0_4_ * auVar7._0_4_;
          auVar193._4_4_ = auVar157._4_4_ * auVar7._4_4_;
          auVar193._8_4_ = auVar157._8_4_ * auVar7._8_4_;
          auVar193._12_4_ = auVar157._12_4_ * auVar7._12_4_;
          auVar193._16_4_ = auVar157._16_4_ * 0.0;
          auVar193._20_4_ = auVar157._20_4_ * 0.0;
          auVar193._24_4_ = auVar157._24_4_ * 0.0;
          auVar193._28_4_ = 0;
          fVar91 = auVar131._0_4_ * auVar7._0_4_;
          fVar118 = auVar131._4_4_ * auVar7._4_4_;
          auVar39._4_4_ = fVar118;
          auVar39._0_4_ = fVar91;
          fVar119 = auVar131._8_4_ * auVar7._8_4_;
          auVar39._8_4_ = fVar119;
          fVar184 = auVar131._12_4_ * auVar7._12_4_;
          auVar39._12_4_ = fVar184;
          fVar196 = auVar131._16_4_ * 0.0;
          auVar39._16_4_ = fVar196;
          fVar197 = auVar131._20_4_ * 0.0;
          auVar39._20_4_ = fVar197;
          fVar198 = auVar131._24_4_ * 0.0;
          auVar39._24_4_ = fVar198;
          auVar39._28_4_ = local_480._28_4_;
          auVar7 = vfmadd213ps_fma(auVar216,auVar193,auVar180);
          auVar168 = vfmadd213ps_fma(auVar216,auVar39,auVar180);
          auVar40._28_4_ = auVar157._28_4_;
          auVar40._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * auVar7._12_4_,
                                  CONCAT48(fVar121 * auVar7._8_4_,
                                           CONCAT44(fVar117 * auVar7._4_4_,fVar116 * auVar7._0_4_)))
                       );
          auVar131 = ZEXT1632(CONCAT412(fVar120 * auVar168._12_4_,
                                        CONCAT48(fVar121 * auVar168._8_4_,
                                                 CONCAT44(fVar117 * auVar168._4_4_,
                                                          fVar116 * auVar168._0_4_))));
          auVar7 = vfmadd213ps_fma(local_5a0,auVar40,auVar175);
          auVar168 = vfmadd213ps_fma(local_5a0,auVar131,auVar175);
          auVar189 = vfmadd213ps_fma(local_2c0,auVar40,local_560);
          auVar73 = vfmadd213ps_fma(local_2c0,auVar131,local_560);
          auVar236 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar69 = vfmadd213ps_fma(auVar40,local_580,local_540);
          auVar68 = vfmadd213ps_fma(local_580,auVar131,local_540);
          auVar41._4_4_ = (float)local_520._4_4_ * auVar193._4_4_;
          auVar41._0_4_ = (float)local_520._0_4_ * auVar193._0_4_;
          auVar41._8_4_ = fStack_518 * auVar193._8_4_;
          auVar41._12_4_ = fStack_514 * auVar193._12_4_;
          auVar41._16_4_ = fStack_510 * auVar193._16_4_;
          auVar41._20_4_ = fStack_50c * auVar193._20_4_;
          auVar41._24_4_ = fStack_508 * auVar193._24_4_;
          auVar41._28_4_ = 0;
          local_920 = vsubps_avx(auVar41,ZEXT1632(auVar7));
          auVar158._0_4_ = (float)local_500._0_4_ * auVar193._0_4_;
          auVar158._4_4_ = (float)local_500._4_4_ * auVar193._4_4_;
          auVar158._8_4_ = fStack_4f8 * auVar193._8_4_;
          auVar158._12_4_ = fStack_4f4 * auVar193._12_4_;
          auVar158._16_4_ = fStack_4f0 * auVar193._16_4_;
          auVar158._20_4_ = fStack_4ec * auVar193._20_4_;
          auVar158._24_4_ = fStack_4e8 * auVar193._24_4_;
          auVar158._28_4_ = 0;
          auVar157 = vsubps_avx(auVar158,ZEXT1632(auVar189));
          auVar181._0_4_ = local_640 * auVar193._0_4_;
          auVar181._4_4_ = fStack_63c * auVar193._4_4_;
          auVar181._8_4_ = fStack_638 * auVar193._8_4_;
          auVar181._12_4_ = fStack_634 * auVar193._12_4_;
          auVar181._16_4_ = fStack_630 * auVar193._16_4_;
          auVar181._20_4_ = fStack_62c * auVar193._20_4_;
          auVar181._24_4_ = fStack_628 * auVar193._24_4_;
          auVar181._28_4_ = 0;
          auVar131 = vsubps_avx(auVar181,ZEXT1632(auVar69));
          _local_ae0 = auVar131._0_28_;
          auVar42._4_4_ = fVar118 * (float)local_520._4_4_;
          auVar42._0_4_ = fVar91 * (float)local_520._0_4_;
          auVar42._8_4_ = fVar119 * fStack_518;
          auVar42._12_4_ = fVar184 * fStack_514;
          auVar42._16_4_ = fVar196 * fStack_510;
          auVar42._20_4_ = fVar197 * fStack_50c;
          auVar42._24_4_ = fVar198 * fStack_508;
          auVar42._28_4_ = auVar131._28_4_;
          auVar131 = vsubps_avx(auVar42,ZEXT1632(auVar168));
          auVar43._4_4_ = fVar118 * (float)local_500._4_4_;
          auVar43._0_4_ = fVar91 * (float)local_500._0_4_;
          auVar43._8_4_ = fVar119 * fStack_4f8;
          auVar43._12_4_ = fVar184 * fStack_4f4;
          auVar43._16_4_ = fVar196 * fStack_4f0;
          auVar43._20_4_ = fVar197 * fStack_4ec;
          auVar43._24_4_ = fVar198 * fStack_4e8;
          auVar43._28_4_ = 0;
          auVar180 = vsubps_avx(auVar43,ZEXT1632(auVar73));
          auVar44._4_4_ = fVar118 * fStack_63c;
          auVar44._0_4_ = fVar91 * local_640;
          auVar44._8_4_ = fVar119 * fStack_638;
          auVar44._12_4_ = fVar184 * fStack_634;
          auVar44._16_4_ = fVar196 * fStack_630;
          auVar44._20_4_ = fVar197 * fStack_62c;
          auVar44._24_4_ = fVar198 * fStack_628;
          auVar44._28_4_ = local_520._28_4_;
          auVar216 = vsubps_avx(auVar44,ZEXT1632(auVar68));
          _local_ac0 = auVar216._0_28_;
          auVar216 = vcmpps_avx(auVar11,ZEXT1632(ZEXT816(0) << 0x40),5);
          auVar211._8_4_ = 0x7f800000;
          auVar211._0_8_ = 0x7f8000007f800000;
          auVar211._12_4_ = 0x7f800000;
          auVar211._16_4_ = 0x7f800000;
          auVar211._20_4_ = 0x7f800000;
          auVar211._24_4_ = 0x7f800000;
          auVar211._28_4_ = 0x7f800000;
          auVar210 = vblendvps_avx(auVar211,auVar193,auVar216);
          auVar11 = vandps_avx(local_660,local_2e0);
          auVar11 = vmaxps_avx(local_440,auVar11);
          auVar45._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar45._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar45._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar45._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar45._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar45._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar45._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar45._28_4_ = auVar11._28_4_;
          auVar174 = vandps_avx(local_660,auVar174);
          auVar174 = vcmpps_avx(auVar174,auVar45,1);
          auVar218._8_4_ = 0xff800000;
          auVar218._0_8_ = 0xff800000ff800000;
          auVar218._12_4_ = 0xff800000;
          auVar218._16_4_ = 0xff800000;
          auVar218._20_4_ = 0xff800000;
          auVar218._24_4_ = 0xff800000;
          auVar218._28_4_ = 0xff800000;
          auVar217 = vblendvps_avx(auVar218,auVar39,auVar216);
          auVar11 = auVar216 & auVar174;
          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar11 >> 0x7f,0) == '\0') &&
                (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0xbf,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar11[0x1f]) {
            auVar237 = ZEXT3264(auVar230);
          }
          else {
            auVar174 = vandps_avx(auVar216,auVar174);
            auVar10 = vcmpps_avx(auVar10,_DAT_01f7b000,2);
            auVar235._8_4_ = 0xff800000;
            auVar235._0_8_ = 0xff800000ff800000;
            auVar235._12_4_ = 0xff800000;
            auVar235._16_4_ = 0xff800000;
            auVar235._20_4_ = 0xff800000;
            auVar235._24_4_ = 0xff800000;
            auVar235._28_4_ = 0xff800000;
            auVar236 = ZEXT3264(auVar235);
            auVar258._8_4_ = 0x7f800000;
            auVar258._0_8_ = 0x7f8000007f800000;
            auVar258._12_4_ = 0x7f800000;
            auVar258._16_4_ = 0x7f800000;
            auVar258._20_4_ = 0x7f800000;
            auVar258._24_4_ = 0x7f800000;
            auVar258._28_4_ = 0x7f800000;
            auVar230 = vblendvps_avx(auVar258,auVar235,auVar10);
            auVar7 = vpackssdw_avx(auVar174._0_16_,auVar174._16_16_);
            auVar11 = vpmovsxwd_avx2(auVar7);
            auVar210 = vblendvps_avx(auVar210,auVar230,auVar11);
            auVar230 = vblendvps_avx(auVar235,auVar258,auVar10);
            auVar217 = vblendvps_avx(auVar217,auVar230,auVar11);
            auVar195._0_8_ = auVar174._0_8_ ^ 0xffffffffffffffff;
            auVar195._8_4_ = auVar174._8_4_ ^ 0xffffffff;
            auVar195._12_4_ = auVar174._12_4_ ^ 0xffffffff;
            auVar195._16_4_ = auVar174._16_4_ ^ 0xffffffff;
            auVar195._20_4_ = auVar174._20_4_ ^ 0xffffffff;
            auVar195._24_4_ = auVar174._24_4_ ^ 0xffffffff;
            auVar195._28_4_ = auVar174._28_4_ ^ 0xffffffff;
            auVar174 = vorps_avx(auVar10,auVar195);
            auVar174 = vandps_avx(auVar216,auVar174);
            auVar237 = ZEXT3264(auVar174);
          }
        }
        uVar62 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar194._4_4_ = uVar62;
        auVar194._0_4_ = uVar62;
        auVar194._8_4_ = uVar62;
        auVar194._12_4_ = uVar62;
        auVar194._16_4_ = uVar62;
        auVar194._20_4_ = uVar62;
        auVar194._24_4_ = uVar62;
        auVar194._28_4_ = uVar62;
        uVar62 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar241._4_4_ = uVar62;
        auVar241._0_4_ = uVar62;
        auVar241._8_4_ = uVar62;
        auVar241._12_4_ = uVar62;
        auVar241._16_4_ = uVar62;
        auVar241._20_4_ = uVar62;
        auVar241._24_4_ = uVar62;
        auVar241._28_4_ = uVar62;
        fVar91 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_460 = vminps_avx(local_4a0,auVar210);
        _local_4c0 = vmaxps_avx(local_480,auVar217);
        auVar174 = vcmpps_avx(local_480,local_460,2);
        local_540 = vandps_avx(auVar80,auVar174);
        auVar174 = vcmpps_avx(_local_4c0,local_4a0,2);
        local_740 = vandps_avx(auVar80,auVar174);
        auVar80 = vorps_avx(local_740,local_540);
        auVar259 = ZEXT3264(local_a00);
        if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0x7f,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0xbf,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar80[0x1f] < '\0') {
          _local_720 = _local_4c0;
          auVar46._4_4_ = fVar91 * (float)local_ac0._4_4_;
          auVar46._0_4_ = fVar91 * (float)local_ac0._0_4_;
          auVar46._8_4_ = fVar91 * fStack_ab8;
          auVar46._12_4_ = fVar91 * fStack_ab4;
          auVar46._16_4_ = fVar91 * fStack_ab0;
          auVar46._20_4_ = fVar91 * fStack_aac;
          auVar46._24_4_ = fVar91 * fStack_aa8;
          auVar46._28_4_ = auVar80._28_4_;
          auVar7 = vfmadd213ps_fma(auVar180,auVar241,auVar46);
          auVar47._4_4_ = fVar91 * (float)local_ae0._4_4_;
          auVar47._0_4_ = fVar91 * (float)local_ae0._0_4_;
          auVar47._8_4_ = fVar91 * fStack_ad8;
          auVar47._12_4_ = fVar91 * fStack_ad4;
          auVar47._16_4_ = fVar91 * fStack_ad0;
          auVar47._20_4_ = fVar91 * fStack_acc;
          auVar47._24_4_ = fVar91 * fStack_ac8;
          auVar47._28_4_ = auVar80._28_4_;
          auVar168 = vfmadd213ps_fma(auVar157,auVar241,auVar47);
          auVar7 = vfmadd213ps_fma(auVar131,auVar194,ZEXT1632(auVar7));
          auVar85._0_8_ = auVar237._0_8_ ^ 0xffffffffffffffff;
          auVar85._8_4_ = auVar237._8_4_ ^ 0xffffffff;
          auVar85._12_4_ = auVar237._12_4_ ^ 0xffffffff;
          auVar85._16_4_ = auVar237._16_4_ ^ 0xffffffff;
          auVar85._20_4_ = auVar237._20_4_ ^ 0xffffffff;
          auVar85._24_4_ = auVar237._24_4_ ^ 0xffffffff;
          auVar85._28_4_ = auVar237._28_4_ ^ 0xffffffff;
          auVar80 = vandps_avx(ZEXT1632(auVar7),local_660);
          auVar182._8_4_ = 0x3e99999a;
          auVar182._0_8_ = 0x3e99999a3e99999a;
          auVar182._12_4_ = 0x3e99999a;
          auVar182._16_4_ = 0x3e99999a;
          auVar182._20_4_ = 0x3e99999a;
          auVar182._24_4_ = 0x3e99999a;
          auVar182._28_4_ = 0x3e99999a;
          auVar80 = vcmpps_avx(auVar80,auVar182,1);
          local_580 = vorps_avx(auVar80,auVar85);
          auVar7 = vfmadd213ps_fma(local_920,auVar194,ZEXT1632(auVar168));
          auVar80 = vandps_avx(ZEXT1632(auVar7),local_660);
          auVar80 = vcmpps_avx(auVar80,auVar182,1);
          auVar80 = vorps_avx(auVar80,auVar85);
          auVar113._8_4_ = 3;
          auVar113._0_8_ = 0x300000003;
          auVar113._12_4_ = 3;
          auVar113._16_4_ = 3;
          auVar113._20_4_ = 3;
          auVar113._24_4_ = 3;
          auVar113._28_4_ = 3;
          auVar135._8_4_ = 2;
          auVar135._0_8_ = 0x200000002;
          auVar135._12_4_ = 2;
          auVar135._16_4_ = 2;
          auVar135._20_4_ = 2;
          auVar135._24_4_ = 2;
          auVar135._28_4_ = 2;
          auVar80 = vblendvps_avx(auVar135,auVar113,auVar80);
          local_5a0._4_4_ = local_aec;
          local_5a0._0_4_ = local_aec;
          local_5a0._8_4_ = local_aec;
          local_5a0._12_4_ = local_aec;
          local_5a0._16_4_ = local_aec;
          local_5a0._20_4_ = local_aec;
          local_5a0._24_4_ = local_aec;
          local_5a0._28_4_ = local_aec;
          local_560 = vpcmpgtd_avx2(auVar80,local_5a0);
          auVar80 = vpandn_avx2(local_560,local_540);
          local_7e0 = local_480;
          local_760._4_4_ = local_480._4_4_ + (float)local_620._4_4_;
          local_760._0_4_ = local_480._0_4_ + (float)local_620._0_4_;
          fStack_758 = local_480._8_4_ + fStack_618;
          fStack_754 = local_480._12_4_ + fStack_614;
          fStack_750 = local_480._16_4_ + fStack_610;
          fStack_74c = local_480._20_4_ + fStack_60c;
          fStack_748 = local_480._24_4_ + fStack_608;
          fStack_744 = local_480._28_4_ + fStack_604;
          local_980 = auVar13;
          local_7c0 = auVar14;
          while( true ) {
            local_400 = auVar80;
            if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar80 >> 0x7f,0) == '\0') &&
                  (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar80 >> 0xbf,0) == '\0') &&
                (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar80[0x1f]) break;
            auVar114._8_4_ = 0x7f800000;
            auVar114._0_8_ = 0x7f8000007f800000;
            auVar114._12_4_ = 0x7f800000;
            auVar114._16_4_ = 0x7f800000;
            auVar114._20_4_ = 0x7f800000;
            auVar114._24_4_ = 0x7f800000;
            auVar114._28_4_ = 0x7f800000;
            auVar174 = vblendvps_avx(auVar114,local_7e0,auVar80);
            auVar230 = vshufps_avx(auVar174,auVar174,0xb1);
            auVar230 = vminps_avx(auVar174,auVar230);
            auVar10 = vshufpd_avx(auVar230,auVar230,5);
            auVar230 = vminps_avx(auVar230,auVar10);
            auVar10 = vpermpd_avx2(auVar230,0x4e);
            auVar230 = vminps_avx(auVar230,auVar10);
            auVar174 = vcmpps_avx(auVar174,auVar230,0);
            auVar230 = auVar80 & auVar174;
            if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar230 >> 0x7f,0) != '\0') ||
                  (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar230 >> 0xbf,0) != '\0') ||
                (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar230[0x1f] < '\0') {
              auVar80 = vandps_avx(auVar174,auVar80);
            }
            uVar56 = vmovmskps_avx(auVar80);
            iVar12 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar59 = iVar12 << 2;
            *(undefined4 *)(local_400 + uVar59) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_920._0_16_ = (undefined1  [16])aVar1;
            auVar7 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar56 = *(uint *)(local_1a0 + uVar59);
            uVar59 = *(uint *)(local_480 + uVar59);
            if (auVar7._0_4_ < 0.0) {
              auVar236 = ZEXT1664(auVar236._0_16_);
              auVar237 = ZEXT1664(auVar237._0_16_);
              fVar91 = sqrtf(auVar7._0_4_);
              auVar259 = ZEXT3264(local_a00);
            }
            else {
              auVar7 = vsqrtss_avx(auVar7,auVar7);
              fVar91 = auVar7._0_4_;
            }
            auVar168 = vminps_avx(local_990,local_9b0);
            auVar7 = vmaxps_avx(local_990,local_9b0);
            auVar189 = vminps_avx(local_9a0,_local_9c0);
            auVar73 = vminps_avx(auVar168,auVar189);
            auVar168 = vmaxps_avx(local_9a0,_local_9c0);
            auVar189 = vmaxps_avx(auVar7,auVar168);
            auVar7 = vandps_avx(auVar73,local_9d0);
            auVar168 = vandps_avx(auVar189,local_9d0);
            auVar7 = vmaxps_avx(auVar7,auVar168);
            auVar168 = vmovshdup_avx(auVar7);
            auVar168 = vmaxss_avx(auVar168,auVar7);
            auVar7 = vshufpd_avx(auVar7,auVar7,1);
            auVar7 = vmaxss_avx(auVar7,auVar168);
            local_820._0_4_ = auVar7._0_4_ * 1.9073486e-06;
            local_840._0_4_ = fVar91 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
            auVar7 = vinsertps_avx(ZEXT416(uVar59),ZEXT416(uVar56),0x10);
            auVar222 = ZEXT1664(auVar7);
            lVar58 = 5;
            do {
              do {
                bVar64 = lVar58 == 0;
                lVar58 = lVar58 + -1;
                if (bVar64) goto LAB_0118eba1;
                auVar69 = auVar222._0_16_;
                local_940._0_16_ = vmovshdup_avx(auVar69);
                fVar121 = 1.0 - local_940._0_4_;
                auVar7 = vshufps_avx(auVar69,auVar69,0x55);
                fVar91 = auVar7._0_4_;
                auVar95._0_4_ = local_9b0._0_4_ * fVar91;
                fVar116 = auVar7._4_4_;
                auVar95._4_4_ = local_9b0._4_4_ * fVar116;
                fVar117 = auVar7._8_4_;
                auVar95._8_4_ = local_9b0._8_4_ * fVar117;
                fVar118 = auVar7._12_4_;
                auVar95._12_4_ = local_9b0._12_4_ * fVar118;
                auVar124._4_4_ = fVar121;
                auVar124._0_4_ = fVar121;
                auVar124._8_4_ = fVar121;
                auVar124._12_4_ = fVar121;
                auVar7 = vfmadd231ps_fma(auVar95,auVar124,local_990);
                auVar141._0_4_ = local_9a0._0_4_ * fVar91;
                auVar141._4_4_ = local_9a0._4_4_ * fVar116;
                auVar141._8_4_ = local_9a0._8_4_ * fVar117;
                auVar141._12_4_ = local_9a0._12_4_ * fVar118;
                auVar168 = vfmadd231ps_fma(auVar141,auVar124,local_9b0);
                auVar188._0_4_ = fVar91 * auVar168._0_4_;
                auVar188._4_4_ = fVar116 * auVar168._4_4_;
                auVar188._8_4_ = fVar117 * auVar168._8_4_;
                auVar188._12_4_ = fVar118 * auVar168._12_4_;
                auVar189 = vfmadd231ps_fma(auVar188,auVar124,auVar7);
                auVar96._0_4_ = fVar91 * (float)local_9c0._0_4_;
                auVar96._4_4_ = fVar116 * (float)local_9c0._4_4_;
                auVar96._8_4_ = fVar117 * fStack_9b8;
                auVar96._12_4_ = fVar118 * fStack_9b4;
                auVar7 = vfmadd231ps_fma(auVar96,auVar124,local_9a0);
                auVar167._0_4_ = fVar91 * auVar7._0_4_;
                auVar167._4_4_ = fVar116 * auVar7._4_4_;
                auVar167._8_4_ = fVar117 * auVar7._8_4_;
                auVar167._12_4_ = fVar118 * auVar7._12_4_;
                auVar168 = vfmadd231ps_fma(auVar167,auVar124,auVar168);
                uVar62 = auVar222._0_4_;
                auVar97._4_4_ = uVar62;
                auVar97._0_4_ = uVar62;
                auVar97._8_4_ = uVar62;
                auVar97._12_4_ = uVar62;
                auVar7 = vfmadd213ps_fma(auVar97,local_920._0_16_,_DAT_01f45a50);
                auVar72._0_4_ = fVar91 * auVar168._0_4_;
                auVar72._4_4_ = fVar116 * auVar168._4_4_;
                auVar72._8_4_ = fVar117 * auVar168._8_4_;
                auVar72._12_4_ = fVar118 * auVar168._12_4_;
                auVar73 = vfmadd231ps_fma(auVar72,auVar189,auVar124);
                local_680._0_16_ = auVar73;
                auVar7 = vsubps_avx(auVar7,auVar73);
                _local_7a0 = auVar7;
                auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar91 = auVar7._0_4_;
                if (fVar91 < 0.0) {
                  local_960._0_16_ = ZEXT416((uint)fVar121);
                  local_a20._0_16_ = auVar189;
                  local_980._0_16_ = auVar168;
                  auVar259._0_4_ = sqrtf(fVar91);
                  auVar259._4_60_ = extraout_var;
                  auVar222 = ZEXT1664(auVar69);
                  auVar73 = auVar259._0_16_;
                  auVar168 = local_980._0_16_;
                  auVar189 = local_a20._0_16_;
                  auVar68 = local_960._0_16_;
                }
                else {
                  auVar73 = vsqrtss_avx(auVar7,auVar7);
                  auVar68 = ZEXT416((uint)fVar121);
                }
                auVar168 = vsubps_avx(auVar168,auVar189);
                auVar205._0_4_ = auVar168._0_4_ * 3.0;
                auVar205._4_4_ = auVar168._4_4_ * 3.0;
                auVar205._8_4_ = auVar168._8_4_ * 3.0;
                auVar205._12_4_ = auVar168._12_4_ * 3.0;
                auVar168 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar68,local_940._0_16_);
                auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940._0_16_,auVar68);
                fVar116 = auVar68._0_4_ * 6.0;
                fVar117 = auVar168._0_4_ * 6.0;
                fVar118 = auVar189._0_4_ * 6.0;
                fVar121 = local_940._0_4_ * 6.0;
                auVar142._0_4_ = fVar121 * (float)local_9c0._0_4_;
                auVar142._4_4_ = fVar121 * (float)local_9c0._4_4_;
                auVar142._8_4_ = fVar121 * fStack_9b8;
                auVar142._12_4_ = fVar121 * fStack_9b4;
                auVar98._4_4_ = fVar118;
                auVar98._0_4_ = fVar118;
                auVar98._8_4_ = fVar118;
                auVar98._12_4_ = fVar118;
                auVar168 = vfmadd132ps_fma(auVar98,auVar142,local_9a0);
                auVar143._4_4_ = fVar117;
                auVar143._0_4_ = fVar117;
                auVar143._8_4_ = fVar117;
                auVar143._12_4_ = fVar117;
                auVar168 = vfmadd132ps_fma(auVar143,auVar168,local_9b0);
                auVar189 = vdpps_avx(auVar205,auVar205,0x7f);
                auVar99._4_4_ = fVar116;
                auVar99._0_4_ = fVar116;
                auVar99._8_4_ = fVar116;
                auVar99._12_4_ = fVar116;
                auVar93 = vfmadd132ps_fma(auVar99,auVar168,local_990);
                auVar168 = vblendps_avx(auVar189,_DAT_01f45a50,0xe);
                auVar68 = vrsqrtss_avx(auVar168,auVar168);
                fVar118 = auVar189._0_4_;
                fVar116 = auVar68._0_4_;
                auVar68 = vdpps_avx(auVar205,auVar93,0x7f);
                fVar116 = fVar116 * 1.5 + fVar118 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar100._0_4_ = auVar93._0_4_ * fVar118;
                auVar100._4_4_ = auVar93._4_4_ * fVar118;
                auVar100._8_4_ = auVar93._8_4_ * fVar118;
                auVar100._12_4_ = auVar93._12_4_ * fVar118;
                fVar117 = auVar68._0_4_;
                auVar190._0_4_ = auVar205._0_4_ * fVar117;
                auVar190._4_4_ = auVar205._4_4_ * fVar117;
                auVar190._8_4_ = auVar205._8_4_ * fVar117;
                auVar190._12_4_ = auVar205._12_4_ * fVar117;
                auVar68 = vsubps_avx(auVar100,auVar190);
                auVar168 = vrcpss_avx(auVar168,auVar168);
                auVar93 = vfnmadd213ss_fma(auVar168,auVar189,ZEXT416(0x40000000));
                fVar117 = auVar168._0_4_ * auVar93._0_4_;
                auVar168 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar222._0_4_ * (float)local_840._0_4_)));
                auVar237 = ZEXT1664(auVar168);
                uVar60 = CONCAT44(auVar205._4_4_,auVar205._0_4_);
                auVar215._0_8_ = uVar60 ^ 0x8000000080000000;
                auVar215._8_4_ = -auVar205._8_4_;
                auVar215._12_4_ = -auVar205._12_4_;
                auVar144._0_4_ = fVar116 * auVar68._0_4_ * fVar117;
                auVar144._4_4_ = fVar116 * auVar68._4_4_ * fVar117;
                auVar144._8_4_ = fVar116 * auVar68._8_4_ * fVar117;
                auVar144._12_4_ = fVar116 * auVar68._12_4_ * fVar117;
                auVar229._0_4_ = auVar205._0_4_ * fVar116;
                auVar229._4_4_ = auVar205._4_4_ * fVar116;
                auVar229._8_4_ = auVar205._8_4_ * fVar116;
                auVar229._12_4_ = auVar205._12_4_ * fVar116;
                local_940._0_16_ = auVar205;
                local_960._0_4_ = auVar168._0_4_;
                if (fVar118 < -fVar118) {
                  local_a20._0_4_ = auVar73._0_4_;
                  local_980._0_16_ = auVar215;
                  local_7c0._0_16_ = auVar229;
                  local_8c0._0_16_ = auVar144;
                  fVar116 = sqrtf(fVar118);
                  auVar73 = ZEXT416((uint)local_a20._0_4_);
                  auVar237 = ZEXT464((uint)local_960._0_4_);
                  auVar144 = local_8c0._0_16_;
                  auVar215 = local_980._0_16_;
                  auVar229 = local_7c0._0_16_;
                }
                else {
                  auVar168 = vsqrtss_avx(auVar189,auVar189);
                  fVar116 = auVar168._0_4_;
                }
                auVar168 = vdpps_avx(_local_7a0,auVar229,0x7f);
                auVar125 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar73,auVar237._0_16_);
                auVar189 = vdpps_avx(auVar215,auVar229,0x7f);
                auVar68 = vdpps_avx(_local_7a0,auVar144,0x7f);
                auVar93 = vdpps_avx(local_920._0_16_,auVar229,0x7f);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(auVar73._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_820._0_4_ / fVar116)),auVar125
                                         );
                auVar74._0_4_ = auVar168._0_4_ * auVar168._0_4_;
                auVar74._4_4_ = auVar168._4_4_ * auVar168._4_4_;
                auVar74._8_4_ = auVar168._8_4_ * auVar168._8_4_;
                auVar74._12_4_ = auVar168._12_4_ * auVar168._12_4_;
                auVar73 = vdpps_avx(_local_7a0,auVar215,0x7f);
                auVar67 = vsubps_avx(auVar7,auVar74);
                auVar125 = vrsqrtss_avx(auVar67,auVar67);
                fVar117 = auVar67._0_4_;
                fVar116 = auVar125._0_4_;
                fVar116 = fVar116 * 1.5 + fVar117 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar125 = vdpps_avx(_local_7a0,local_920._0_16_,0x7f);
                local_a20._0_16_ = ZEXT416((uint)(auVar189._0_4_ + auVar68._0_4_));
                auVar189 = vfnmadd231ss_fma(auVar73,auVar168,local_a20._0_16_);
                auVar73 = vfnmadd231ss_fma(auVar125,auVar168,auVar93);
                if (fVar117 < 0.0) {
                  local_980._0_16_ = auVar168;
                  local_7c0._0_4_ = auVar94._0_4_;
                  local_8c0._0_16_ = auVar93;
                  local_6a0._0_16_ = auVar189;
                  local_6c0._0_4_ = fVar116;
                  local_6e0._0_16_ = auVar73;
                  fVar117 = sqrtf(fVar117);
                  auVar237 = ZEXT464((uint)local_960._0_4_);
                  fVar116 = (float)local_6c0._0_4_;
                  auVar73 = local_6e0._0_16_;
                  auVar189 = local_6a0._0_16_;
                  auVar93 = local_8c0._0_16_;
                  auVar168 = local_980._0_16_;
                  fVar118 = (float)local_7c0._0_4_;
                }
                else {
                  auVar68 = vsqrtss_avx(auVar67,auVar67);
                  fVar117 = auVar68._0_4_;
                  fVar118 = auVar94._0_4_;
                }
                auVar259 = ZEXT3264(local_a00);
                auVar68 = vpermilps_avx(local_680._0_16_,0xff);
                fVar117 = fVar117 - auVar68._0_4_;
                auVar68 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
                auVar189 = vfmsub213ss_fma(auVar189,ZEXT416((uint)fVar116),auVar68);
                auVar145._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
                auVar145._8_4_ = auVar93._8_4_ ^ 0x80000000;
                auVar145._12_4_ = auVar93._12_4_ ^ 0x80000000;
                auVar169._0_8_ = auVar189._0_8_ ^ 0x8000000080000000;
                auVar169._8_4_ = auVar189._8_4_ ^ 0x80000000;
                auVar169._12_4_ = auVar189._12_4_ ^ 0x80000000;
                auVar236 = ZEXT1664(local_a20._0_16_);
                auVar125 = ZEXT416((uint)(auVar73._0_4_ * fVar116));
                auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar93._0_4_ * auVar189._0_4_)),
                                          local_a20._0_16_,auVar125);
                auVar189 = vinsertps_avx(auVar169,auVar125,0x1c);
                uVar62 = auVar73._0_4_;
                auVar170._4_4_ = uVar62;
                auVar170._0_4_ = uVar62;
                auVar170._8_4_ = uVar62;
                auVar170._12_4_ = uVar62;
                auVar189 = vdivps_avx(auVar189,auVar170);
                auVar73 = vinsertps_avx(local_a20._0_16_,auVar145,0x10);
                auVar73 = vdivps_avx(auVar73,auVar170);
                fVar116 = auVar168._0_4_;
                auVar126._0_4_ = fVar116 * auVar189._0_4_ + fVar117 * auVar73._0_4_;
                auVar126._4_4_ = fVar116 * auVar189._4_4_ + fVar117 * auVar73._4_4_;
                auVar126._8_4_ = fVar116 * auVar189._8_4_ + fVar117 * auVar73._8_4_;
                auVar126._12_4_ = fVar116 * auVar189._12_4_ + fVar117 * auVar73._12_4_;
                auVar189 = vsubps_avx(auVar69,auVar126);
                auVar222 = ZEXT1664(auVar189);
                auVar168 = vandps_avx(auVar168,local_9d0);
              } while (fVar118 <= auVar168._0_4_);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar237._0_4_ + fVar118)),local_700._0_16_,
                                        ZEXT416(0x36000000));
              auVar168 = vandps_avx(ZEXT416((uint)fVar117),local_9d0);
            } while (auVar73._0_4_ <= auVar168._0_4_);
            fVar116 = auVar189._0_4_ + (float)local_780._0_4_;
            if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar116) {
              fVar117 = (ray->super_RayK<1>).tfar;
              auVar237 = ZEXT464((uint)fVar117);
              if (fVar116 <= fVar117) {
                auVar168 = vmovshdup_avx(auVar189);
                fVar118 = auVar168._0_4_;
                if ((0.0 <= fVar118) && (fVar118 <= 1.0)) {
                  auVar7 = vrsqrtss_avx(auVar7,auVar7);
                  fVar121 = auVar7._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar57].ptr;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                    fVar91 = fVar121 * 1.5 + fVar91 * -0.5 * fVar121 * fVar121 * fVar121;
                    auVar146._0_4_ = fVar91 * (float)local_7a0._0_4_;
                    auVar146._4_4_ = fVar91 * (float)local_7a0._4_4_;
                    auVar146._8_4_ = fVar91 * fStack_798;
                    auVar146._12_4_ = fVar91 * fStack_794;
                    auVar73 = vfmadd213ps_fma(auVar68,auVar146,local_940._0_16_);
                    auVar7 = vshufps_avx(auVar146,auVar146,0xc9);
                    auVar168 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                    auVar147._0_4_ = auVar146._0_4_ * auVar168._0_4_;
                    auVar147._4_4_ = auVar146._4_4_ * auVar168._4_4_;
                    auVar147._8_4_ = auVar146._8_4_ * auVar168._8_4_;
                    auVar147._12_4_ = auVar146._12_4_ * auVar168._12_4_;
                    auVar189 = vfmsub231ps_fma(auVar147,local_940._0_16_,auVar7);
                    auVar7 = vshufps_avx(auVar189,auVar189,0xc9);
                    auVar168 = vshufps_avx(auVar73,auVar73,0xc9);
                    auVar189 = vshufps_avx(auVar189,auVar189,0xd2);
                    auVar75._0_4_ = auVar73._0_4_ * auVar189._0_4_;
                    auVar75._4_4_ = auVar73._4_4_ * auVar189._4_4_;
                    auVar75._8_4_ = auVar73._8_4_ * auVar189._8_4_;
                    auVar75._12_4_ = auVar73._12_4_ * auVar189._12_4_;
                    auVar168 = vfmsub231ps_fma(auVar75,auVar7,auVar168);
                    auVar7 = vshufps_avx(auVar168,auVar168,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar116;
                      uVar65 = vmovlps_avx(auVar7);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar65;
                      (ray->Ng).field_0.field_0.z = auVar168._0_4_;
                      ray->u = fVar118;
                      ray->v = 0.0;
                      ray->primID = (uint)local_800;
                      ray->geomID = uVar57;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_8f0 = vmovlps_avx(auVar7);
                      local_8e8 = auVar168._0_4_;
                      local_8e4 = fVar118;
                      local_8e0 = 0;
                      local_8dc = (uint)local_800;
                      local_8d8 = uVar57;
                      local_8d4 = context->user->instID[0];
                      local_8d0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar116;
                      local_600._0_4_ = 0xffffffff;
                      local_a58.valid = (int *)local_600;
                      local_a58.geometryUserPtr = pGVar4->userPtr;
                      local_a58.context = context->user;
                      local_a58.hit = (RTCHitN *)&local_8f0;
                      local_a58.N = 1;
                      local_a58.ray = (RTCRayN *)ray;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0118ecbd:
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar236 = ZEXT1664(auVar236._0_16_);
                          auVar237 = ZEXT1664(auVar237._0_16_);
                          (*p_Var5)(&local_a58);
                          auVar259 = ZEXT3264(local_a00);
                          if (*local_a58.valid == 0) goto LAB_0118ed6c;
                        }
                        (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                             *(float *)local_a58.hit;
                        (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_a58.hit + 4);
                        (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_a58.hit + 8);
                        *(float *)((long)local_a58.ray + 0x3c) = *(float *)(local_a58.hit + 0xc);
                        *(float *)((long)local_a58.ray + 0x40) = *(float *)(local_a58.hit + 0x10);
                        *(float *)((long)local_a58.ray + 0x44) = *(float *)(local_a58.hit + 0x14);
                        *(float *)((long)local_a58.ray + 0x48) = *(float *)(local_a58.hit + 0x18);
                        *(float *)((long)local_a58.ray + 0x4c) = *(float *)(local_a58.hit + 0x1c);
                        *(float *)((long)local_a58.ray + 0x50) = *(float *)(local_a58.hit + 0x20);
                      }
                      else {
                        auVar236 = ZEXT1664(local_a20._0_16_);
                        auVar237 = ZEXT464((uint)fVar117);
                        (*pGVar4->intersectionFilterN)(&local_a58);
                        auVar259 = ZEXT3264(local_a00);
                        if (*local_a58.valid != 0) goto LAB_0118ecbd;
LAB_0118ed6c:
                        (ray->super_RayK<1>).tfar = fVar117;
                      }
                    }
                  }
                }
              }
            }
LAB_0118eba1:
            fVar91 = (ray->super_RayK<1>).tfar;
            auVar86._4_4_ = fVar91;
            auVar86._0_4_ = fVar91;
            auVar86._8_4_ = fVar91;
            auVar86._12_4_ = fVar91;
            auVar86._16_4_ = fVar91;
            auVar86._20_4_ = fVar91;
            auVar86._24_4_ = fVar91;
            auVar86._28_4_ = fVar91;
            auVar80 = vcmpps_avx(_local_760,auVar86,2);
            auVar80 = vandps_avx(auVar80,local_400);
          }
          auVar87._0_4_ = (float)local_620._0_4_ + (float)local_720._0_4_;
          auVar87._4_4_ = (float)local_620._4_4_ + (float)local_720._4_4_;
          auVar87._8_4_ = fStack_618 + fStack_718;
          auVar87._12_4_ = fStack_614 + fStack_714;
          auVar87._16_4_ = fStack_610 + fStack_710;
          auVar87._20_4_ = fStack_60c + fStack_70c;
          auVar87._24_4_ = fStack_608 + fStack_708;
          auVar87._28_4_ = fStack_604 + fStack_704;
          fVar116 = (ray->super_RayK<1>).tfar;
          fVar91 = (ray->super_RayK<1>).tfar;
          auVar136._4_4_ = fVar91;
          auVar136._0_4_ = fVar91;
          auVar136._8_4_ = fVar91;
          auVar136._12_4_ = fVar91;
          auVar136._16_4_ = fVar91;
          auVar136._20_4_ = fVar91;
          auVar136._24_4_ = fVar91;
          auVar136._28_4_ = fVar91;
          auVar80 = vcmpps_avx(auVar87,auVar136,2);
          local_740 = vandps_avx(auVar80,local_740);
          auVar88._8_4_ = 3;
          auVar88._0_8_ = 0x300000003;
          auVar88._12_4_ = 3;
          auVar88._16_4_ = 3;
          auVar88._20_4_ = 3;
          auVar88._24_4_ = 3;
          auVar88._28_4_ = 3;
          auVar137._8_4_ = 2;
          auVar137._0_8_ = 0x200000002;
          auVar137._12_4_ = 2;
          auVar137._16_4_ = 2;
          auVar137._20_4_ = 2;
          auVar137._24_4_ = 2;
          auVar137._28_4_ = 2;
          auVar80 = vblendvps_avx(auVar137,auVar88,local_580);
          _local_760 = vpcmpgtd_avx2(auVar80,local_5a0);
          auVar80 = vpandn_avx2(_local_760,local_740);
          local_7e0 = _local_4c0;
          local_720._4_4_ = (float)local_620._4_4_ + (float)local_4c0._4_4_;
          local_720._0_4_ = (float)local_620._0_4_ + (float)local_4c0._0_4_;
          fStack_718 = fStack_618 + fStack_4b8;
          fStack_714 = fStack_614 + fStack_4b4;
          fStack_710 = fStack_610 + fStack_4b0;
          fStack_70c = fStack_60c + fStack_4ac;
          fStack_708 = fStack_608 + fStack_4a8;
          fStack_704 = fStack_604 + fStack_4a4;
          auVar222 = ZEXT3264(local_860);
          auVar242 = ZEXT3264(local_880);
          auVar245 = ZEXT3264(local_8a0);
          while( true ) {
            local_600 = auVar80;
            if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar80 >> 0x7f,0) == '\0') &&
                  (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar80 >> 0xbf,0) == '\0') &&
                (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar80[0x1f]) break;
            auVar115._8_4_ = 0x7f800000;
            auVar115._0_8_ = 0x7f8000007f800000;
            auVar115._12_4_ = 0x7f800000;
            auVar115._16_4_ = 0x7f800000;
            auVar115._20_4_ = 0x7f800000;
            auVar115._24_4_ = 0x7f800000;
            auVar115._28_4_ = 0x7f800000;
            auVar174 = vblendvps_avx(auVar115,local_7e0,auVar80);
            auVar230 = vshufps_avx(auVar174,auVar174,0xb1);
            auVar230 = vminps_avx(auVar174,auVar230);
            auVar10 = vshufpd_avx(auVar230,auVar230,5);
            auVar230 = vminps_avx(auVar230,auVar10);
            auVar10 = vpermpd_avx2(auVar230,0x4e);
            auVar230 = vminps_avx(auVar230,auVar10);
            auVar174 = vcmpps_avx(auVar174,auVar230,0);
            auVar230 = auVar80 & auVar174;
            if ((((((((auVar230 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar230 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar230 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar230 >> 0x7f,0) != '\0') ||
                  (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar230 >> 0xbf,0) != '\0') ||
                (auVar230 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar230[0x1f] < '\0') {
              auVar80 = vandps_avx(auVar174,auVar80);
            }
            uVar56 = vmovmskps_avx(auVar80);
            iVar12 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar12 = iVar12 + 1;
            }
            uVar59 = iVar12 << 2;
            *(undefined4 *)(local_600 + uVar59) = 0;
            aVar1 = (ray->super_RayK<1>).dir.field_0;
            local_920._0_16_ = (undefined1  [16])aVar1;
            auVar7 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            uVar56 = *(uint *)(local_1c0 + uVar59);
            uVar59 = *(uint *)(local_4a0 + uVar59);
            if (auVar7._0_4_ < 0.0) {
              auVar236 = ZEXT1664(auVar236._0_16_);
              auVar237 = ZEXT1664(auVar237._0_16_);
              fVar91 = sqrtf(auVar7._0_4_);
              auVar259 = ZEXT3264(local_a00);
              auVar245 = ZEXT3264(local_8a0);
              auVar242 = ZEXT3264(local_880);
              auVar222 = ZEXT3264(local_860);
            }
            else {
              auVar7 = vsqrtss_avx(auVar7,auVar7);
              fVar91 = auVar7._0_4_;
            }
            auVar168 = vminps_avx(local_990,local_9b0);
            auVar7 = vmaxps_avx(local_990,local_9b0);
            auVar189 = vminps_avx(local_9a0,_local_9c0);
            auVar73 = vminps_avx(auVar168,auVar189);
            auVar168 = vmaxps_avx(local_9a0,_local_9c0);
            auVar189 = vmaxps_avx(auVar7,auVar168);
            auVar7 = vandps_avx(auVar73,local_9d0);
            auVar168 = vandps_avx(auVar189,local_9d0);
            auVar7 = vmaxps_avx(auVar7,auVar168);
            auVar168 = vmovshdup_avx(auVar7);
            auVar168 = vmaxss_avx(auVar168,auVar7);
            auVar7 = vshufpd_avx(auVar7,auVar7,1);
            auVar7 = vmaxss_avx(auVar7,auVar168);
            local_820._0_4_ = auVar7._0_4_ * 1.9073486e-06;
            local_7c0._0_4_ = fVar91 * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar189,auVar189,0xff);
            auVar7 = vinsertps_avx(ZEXT416(uVar59),ZEXT416(uVar56),0x10);
            auVar219 = ZEXT1664(auVar7);
            lVar58 = 5;
            do {
              do {
                bVar64 = lVar58 == 0;
                lVar58 = lVar58 + -1;
                if (bVar64) goto LAB_0118f5be;
                auVar69 = auVar219._0_16_;
                local_940._0_16_ = vmovshdup_avx(auVar69);
                fVar121 = 1.0 - local_940._0_4_;
                auVar7 = vshufps_avx(auVar69,auVar69,0x55);
                fVar91 = auVar7._0_4_;
                auVar101._0_4_ = local_9b0._0_4_ * fVar91;
                fVar116 = auVar7._4_4_;
                auVar101._4_4_ = local_9b0._4_4_ * fVar116;
                fVar117 = auVar7._8_4_;
                auVar101._8_4_ = local_9b0._8_4_ * fVar117;
                fVar118 = auVar7._12_4_;
                auVar101._12_4_ = local_9b0._12_4_ * fVar118;
                auVar127._4_4_ = fVar121;
                auVar127._0_4_ = fVar121;
                auVar127._8_4_ = fVar121;
                auVar127._12_4_ = fVar121;
                auVar7 = vfmadd231ps_fma(auVar101,auVar127,local_990);
                auVar148._0_4_ = local_9a0._0_4_ * fVar91;
                auVar148._4_4_ = local_9a0._4_4_ * fVar116;
                auVar148._8_4_ = local_9a0._8_4_ * fVar117;
                auVar148._12_4_ = local_9a0._12_4_ * fVar118;
                auVar168 = vfmadd231ps_fma(auVar148,auVar127,local_9b0);
                auVar191._0_4_ = fVar91 * auVar168._0_4_;
                auVar191._4_4_ = fVar116 * auVar168._4_4_;
                auVar191._8_4_ = fVar117 * auVar168._8_4_;
                auVar191._12_4_ = fVar118 * auVar168._12_4_;
                auVar189 = vfmadd231ps_fma(auVar191,auVar127,auVar7);
                auVar102._0_4_ = fVar91 * (float)local_9c0._0_4_;
                auVar102._4_4_ = fVar116 * (float)local_9c0._4_4_;
                auVar102._8_4_ = fVar117 * fStack_9b8;
                auVar102._12_4_ = fVar118 * fStack_9b4;
                auVar7 = vfmadd231ps_fma(auVar102,auVar127,local_9a0);
                auVar171._0_4_ = fVar91 * auVar7._0_4_;
                auVar171._4_4_ = fVar116 * auVar7._4_4_;
                auVar171._8_4_ = fVar117 * auVar7._8_4_;
                auVar171._12_4_ = fVar118 * auVar7._12_4_;
                auVar168 = vfmadd231ps_fma(auVar171,auVar127,auVar168);
                uVar62 = auVar219._0_4_;
                auVar103._4_4_ = uVar62;
                auVar103._0_4_ = uVar62;
                auVar103._8_4_ = uVar62;
                auVar103._12_4_ = uVar62;
                auVar7 = vfmadd213ps_fma(auVar103,local_920._0_16_,_DAT_01f45a50);
                auVar76._0_4_ = fVar91 * auVar168._0_4_;
                auVar76._4_4_ = fVar116 * auVar168._4_4_;
                auVar76._8_4_ = fVar117 * auVar168._8_4_;
                auVar76._12_4_ = fVar118 * auVar168._12_4_;
                auVar73 = vfmadd231ps_fma(auVar76,auVar189,auVar127);
                local_680._0_16_ = auVar73;
                auVar7 = vsubps_avx(auVar7,auVar73);
                _local_7a0 = auVar7;
                auVar7 = vdpps_avx(auVar7,auVar7,0x7f);
                fVar91 = auVar7._0_4_;
                if (fVar91 < 0.0) {
                  local_960._0_16_ = ZEXT416((uint)fVar121);
                  local_a20._0_16_ = auVar189;
                  local_840._0_16_ = auVar168;
                  auVar245._0_4_ = sqrtf(fVar91);
                  auVar245._4_60_ = extraout_var_00;
                  auVar219 = ZEXT1664(auVar69);
                  auVar73 = auVar245._0_16_;
                  auVar168 = local_840._0_16_;
                  auVar189 = local_a20._0_16_;
                  auVar68 = local_960._0_16_;
                }
                else {
                  auVar73 = vsqrtss_avx(auVar7,auVar7);
                  auVar68 = ZEXT416((uint)fVar121);
                }
                auVar168 = vsubps_avx(auVar168,auVar189);
                auVar206._0_4_ = auVar168._0_4_ * 3.0;
                auVar206._4_4_ = auVar168._4_4_ * 3.0;
                auVar206._8_4_ = auVar168._8_4_ * 3.0;
                auVar206._12_4_ = auVar168._12_4_ * 3.0;
                auVar168 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar68,local_940._0_16_);
                auVar189 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940._0_16_,auVar68);
                fVar116 = auVar68._0_4_ * 6.0;
                fVar117 = auVar168._0_4_ * 6.0;
                fVar118 = auVar189._0_4_ * 6.0;
                fVar121 = local_940._0_4_ * 6.0;
                auVar149._0_4_ = fVar121 * (float)local_9c0._0_4_;
                auVar149._4_4_ = fVar121 * (float)local_9c0._4_4_;
                auVar149._8_4_ = fVar121 * fStack_9b8;
                auVar149._12_4_ = fVar121 * fStack_9b4;
                auVar104._4_4_ = fVar118;
                auVar104._0_4_ = fVar118;
                auVar104._8_4_ = fVar118;
                auVar104._12_4_ = fVar118;
                auVar168 = vfmadd132ps_fma(auVar104,auVar149,local_9a0);
                auVar150._4_4_ = fVar117;
                auVar150._0_4_ = fVar117;
                auVar150._8_4_ = fVar117;
                auVar150._12_4_ = fVar117;
                auVar168 = vfmadd132ps_fma(auVar150,auVar168,local_9b0);
                auVar189 = vdpps_avx(auVar206,auVar206,0x7f);
                auVar105._4_4_ = fVar116;
                auVar105._0_4_ = fVar116;
                auVar105._8_4_ = fVar116;
                auVar105._12_4_ = fVar116;
                auVar93 = vfmadd132ps_fma(auVar105,auVar168,local_990);
                auVar168 = vblendps_avx(auVar189,_DAT_01f45a50,0xe);
                auVar68 = vrsqrtss_avx(auVar168,auVar168);
                fVar118 = auVar189._0_4_;
                fVar116 = auVar68._0_4_;
                auVar68 = vdpps_avx(auVar206,auVar93,0x7f);
                fVar116 = fVar116 * 1.5 + fVar118 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar106._0_4_ = auVar93._0_4_ * fVar118;
                auVar106._4_4_ = auVar93._4_4_ * fVar118;
                auVar106._8_4_ = auVar93._8_4_ * fVar118;
                auVar106._12_4_ = auVar93._12_4_ * fVar118;
                fVar117 = auVar68._0_4_;
                auVar192._0_4_ = auVar206._0_4_ * fVar117;
                auVar192._4_4_ = auVar206._4_4_ * fVar117;
                auVar192._8_4_ = auVar206._8_4_ * fVar117;
                auVar192._12_4_ = auVar206._12_4_ * fVar117;
                auVar68 = vsubps_avx(auVar106,auVar192);
                auVar168 = vrcpss_avx(auVar168,auVar168);
                auVar93 = vfnmadd213ss_fma(auVar168,auVar189,ZEXT416(0x40000000));
                fVar117 = auVar168._0_4_ * auVar93._0_4_;
                auVar168 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar219._0_4_ * (float)local_7c0._0_4_)));
                uVar60 = CONCAT44(auVar206._4_4_,auVar206._0_4_);
                auVar225._0_8_ = uVar60 ^ 0x8000000080000000;
                auVar225._8_4_ = -auVar206._8_4_;
                auVar225._12_4_ = -auVar206._12_4_;
                auVar151._0_4_ = fVar116 * auVar68._0_4_ * fVar117;
                auVar151._4_4_ = fVar116 * auVar68._4_4_ * fVar117;
                auVar151._8_4_ = fVar116 * auVar68._8_4_ * fVar117;
                auVar151._12_4_ = fVar116 * auVar68._12_4_ * fVar117;
                local_980._0_4_ = auVar206._0_4_ * fVar116;
                local_980._4_4_ = auVar206._4_4_ * fVar116;
                local_980._8_4_ = auVar206._8_4_ * fVar116;
                local_980._12_4_ = auVar206._12_4_ * fVar116;
                local_940._0_16_ = auVar206;
                local_960._0_4_ = auVar168._0_4_;
                if (fVar118 < -fVar118) {
                  local_a20._0_4_ = auVar73._0_4_;
                  local_840._0_16_ = auVar225;
                  local_8c0._0_16_ = auVar151;
                  fVar116 = sqrtf(fVar118);
                  auVar73 = ZEXT416((uint)local_a20._0_4_);
                  auVar168 = ZEXT416((uint)local_960._0_4_);
                  auVar151 = local_8c0._0_16_;
                  auVar225 = local_840._0_16_;
                }
                else {
                  auVar189 = vsqrtss_avx(auVar189,auVar189);
                  fVar116 = auVar189._0_4_;
                }
                local_a20._0_16_ = vdpps_avx(_local_7a0,local_980._0_16_,0x7f);
                auVar93 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar73,auVar168);
                auVar168 = vdpps_avx(auVar225,local_980._0_16_,0x7f);
                auVar189 = vdpps_avx(_local_7a0,auVar151,0x7f);
                auVar68 = vdpps_avx(local_920._0_16_,local_980._0_16_,0x7f);
                auVar73 = vfmadd213ss_fma(ZEXT416((uint)(auVar73._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_820._0_4_ / fVar116)),auVar93)
                ;
                local_840._0_4_ = auVar73._0_4_;
                auVar77._0_4_ = local_a20._0_4_ * local_a20._0_4_;
                auVar77._4_4_ = local_a20._4_4_ * local_a20._4_4_;
                auVar77._8_4_ = local_a20._8_4_ * local_a20._8_4_;
                auVar77._12_4_ = local_a20._12_4_ * local_a20._12_4_;
                auVar73 = vdpps_avx(_local_7a0,auVar225,0x7f);
                auVar125 = vsubps_avx(auVar7,auVar77);
                auVar93 = vrsqrtss_avx(auVar125,auVar125);
                fVar117 = auVar125._0_4_;
                fVar116 = auVar93._0_4_;
                fVar116 = fVar116 * 1.5 + fVar117 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar93 = vdpps_avx(_local_7a0,local_920._0_16_,0x7f);
                local_980._0_16_ = ZEXT416((uint)(auVar168._0_4_ + auVar189._0_4_));
                auVar168 = vfnmadd231ss_fma(auVar73,local_a20._0_16_,local_980._0_16_);
                auVar189 = vfnmadd231ss_fma(auVar93,local_a20._0_16_,auVar68);
                if (fVar117 < 0.0) {
                  local_8c0._0_16_ = auVar68;
                  local_6a0._0_16_ = auVar168;
                  local_6c0._0_4_ = fVar116;
                  local_6e0._0_16_ = auVar189;
                  fVar117 = sqrtf(fVar117);
                  fVar116 = (float)local_6c0._0_4_;
                  auVar189 = local_6e0._0_16_;
                  auVar168 = local_6a0._0_16_;
                  auVar68 = local_8c0._0_16_;
                }
                else {
                  auVar73 = vsqrtss_avx(auVar125,auVar125);
                  fVar117 = auVar73._0_4_;
                }
                auVar237 = ZEXT1664(auVar7);
                auVar222 = ZEXT3264(local_860);
                auVar242 = ZEXT3264(local_880);
                auVar245 = ZEXT3264(local_8a0);
                auVar259 = ZEXT3264(local_a00);
                auVar73 = vpermilps_avx(local_680._0_16_,0xff);
                fVar117 = fVar117 - auVar73._0_4_;
                auVar73 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
                auVar168 = vfmsub213ss_fma(auVar168,ZEXT416((uint)fVar116),auVar73);
                auVar152._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
                auVar152._8_4_ = auVar68._8_4_ ^ 0x80000000;
                auVar152._12_4_ = auVar68._12_4_ ^ 0x80000000;
                auVar172._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                auVar172._8_4_ = auVar168._8_4_ ^ 0x80000000;
                auVar172._12_4_ = auVar168._12_4_ ^ 0x80000000;
                auVar236 = ZEXT1664(local_980._0_16_);
                auVar93 = ZEXT416((uint)(auVar189._0_4_ * fVar116));
                auVar189 = vfmsub231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar168._0_4_)),
                                           local_980._0_16_,auVar93);
                auVar168 = vinsertps_avx(auVar172,auVar93,0x1c);
                uVar62 = auVar189._0_4_;
                auVar173._4_4_ = uVar62;
                auVar173._0_4_ = uVar62;
                auVar173._8_4_ = uVar62;
                auVar173._12_4_ = uVar62;
                auVar168 = vdivps_avx(auVar168,auVar173);
                auVar189 = vinsertps_avx(local_980._0_16_,auVar152,0x10);
                auVar189 = vdivps_avx(auVar189,auVar173);
                fVar116 = local_a20._0_4_;
                auVar128._0_4_ = fVar116 * auVar168._0_4_ + fVar117 * auVar189._0_4_;
                auVar128._4_4_ = fVar116 * auVar168._4_4_ + fVar117 * auVar189._4_4_;
                auVar128._8_4_ = fVar116 * auVar168._8_4_ + fVar117 * auVar189._8_4_;
                auVar128._12_4_ = fVar116 * auVar168._12_4_ + fVar117 * auVar189._12_4_;
                auVar189 = vsubps_avx(auVar69,auVar128);
                auVar219 = ZEXT1664(auVar189);
                auVar168 = vandps_avx(local_a20._0_16_,local_9d0);
              } while ((float)local_840._0_4_ <= auVar168._0_4_);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)((float)local_840._0_4_ +
                                                      (float)local_960._0_4_)),local_700._0_16_,
                                        ZEXT416(0x36000000));
              auVar168 = vandps_avx(ZEXT416((uint)fVar117),local_9d0);
            } while (auVar69._0_4_ <= auVar168._0_4_);
            fVar116 = auVar189._0_4_ + (float)local_780._0_4_;
            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar116) &&
               (fVar117 = (ray->super_RayK<1>).tfar, fVar116 <= fVar117)) {
              auVar168 = vmovshdup_avx(auVar189);
              fVar118 = auVar168._0_4_;
              if ((0.0 <= fVar118) && (fVar118 <= 1.0)) {
                auVar168 = vrsqrtss_avx(auVar7,auVar7);
                fVar121 = auVar168._0_4_;
                pGVar4 = (context->scene->geometries).items[uVar57].ptr;
                if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
                  fVar91 = fVar121 * 1.5 + fVar91 * -0.5 * fVar121 * fVar121 * fVar121;
                  auVar153._0_4_ = fVar91 * (float)local_7a0._0_4_;
                  auVar153._4_4_ = fVar91 * (float)local_7a0._4_4_;
                  auVar153._8_4_ = fVar91 * fStack_798;
                  auVar153._12_4_ = fVar91 * fStack_794;
                  auVar69 = vfmadd213ps_fma(auVar73,auVar153,local_940._0_16_);
                  auVar168 = vshufps_avx(auVar153,auVar153,0xc9);
                  auVar189 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                  auVar154._0_4_ = auVar153._0_4_ * auVar189._0_4_;
                  auVar154._4_4_ = auVar153._4_4_ * auVar189._4_4_;
                  auVar154._8_4_ = auVar153._8_4_ * auVar189._8_4_;
                  auVar154._12_4_ = auVar153._12_4_ * auVar189._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar154,local_940._0_16_,auVar168);
                  auVar168 = vshufps_avx(auVar73,auVar73,0xc9);
                  auVar189 = vshufps_avx(auVar69,auVar69,0xc9);
                  auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                  auVar78._0_4_ = auVar69._0_4_ * auVar73._0_4_;
                  auVar78._4_4_ = auVar69._4_4_ * auVar73._4_4_;
                  auVar78._8_4_ = auVar69._8_4_ * auVar73._8_4_;
                  auVar78._12_4_ = auVar69._12_4_ * auVar73._12_4_;
                  auVar189 = vfmsub231ps_fma(auVar78,auVar168,auVar189);
                  auVar168 = vshufps_avx(auVar189,auVar189,0xe9);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar116;
                    uVar65 = vmovlps_avx(auVar168);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar65;
                    (ray->Ng).field_0.field_0.z = auVar189._0_4_;
                    ray->u = fVar118;
                    ray->v = 0.0;
                    ray->primID = (uint)local_800;
                    ray->geomID = uVar57;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_8f0 = vmovlps_avx(auVar168);
                    local_8e8 = auVar189._0_4_;
                    local_8e4 = fVar118;
                    local_8e0 = 0;
                    local_8dc = (uint)local_800;
                    local_8d8 = uVar57;
                    local_8d4 = context->user->instID[0];
                    local_8d0 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar116;
                    local_a24 = -1;
                    local_a58.valid = &local_a24;
                    local_a58.geometryUserPtr = pGVar4->userPtr;
                    local_a58.context = context->user;
                    local_a58.hit = (RTCHitN *)&local_8f0;
                    local_a58.N = 1;
                    local_a58.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0118f6f5:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar236 = ZEXT1664(auVar236._0_16_);
                        auVar237 = ZEXT1664(auVar237._0_16_);
                        (*p_Var5)(&local_a58);
                        auVar259 = ZEXT3264(local_a00);
                        auVar245 = ZEXT3264(local_8a0);
                        auVar242 = ZEXT3264(local_880);
                        auVar222 = ZEXT3264(local_860);
                        if (*local_a58.valid == 0) goto LAB_0118f7bf;
                      }
                      (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a58.hit;
                      (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a58.hit + 4);
                      (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a58.hit + 8);
                      *(float *)((long)local_a58.ray + 0x3c) = *(float *)(local_a58.hit + 0xc);
                      *(float *)((long)local_a58.ray + 0x40) = *(float *)(local_a58.hit + 0x10);
                      *(float *)((long)local_a58.ray + 0x44) = *(float *)(local_a58.hit + 0x14);
                      *(float *)((long)local_a58.ray + 0x48) = *(float *)(local_a58.hit + 0x18);
                      *(float *)((long)local_a58.ray + 0x4c) = *(float *)(local_a58.hit + 0x1c);
                      *(float *)((long)local_a58.ray + 0x50) = *(float *)(local_a58.hit + 0x20);
                    }
                    else {
                      auVar236 = ZEXT1664(local_980._0_16_);
                      auVar237 = ZEXT1664(auVar7);
                      (*pGVar4->intersectionFilterN)(&local_a58);
                      auVar259 = ZEXT3264(local_a00);
                      auVar245 = ZEXT3264(local_8a0);
                      auVar242 = ZEXT3264(local_880);
                      auVar222 = ZEXT3264(local_860);
                      if (*local_a58.valid != 0) goto LAB_0118f6f5;
LAB_0118f7bf:
                      (ray->super_RayK<1>).tfar = fVar117;
                    }
                  }
                }
              }
            }
LAB_0118f5be:
            fVar91 = (ray->super_RayK<1>).tfar;
            auVar89._4_4_ = fVar91;
            auVar89._0_4_ = fVar91;
            auVar89._8_4_ = fVar91;
            auVar89._12_4_ = fVar91;
            auVar89._16_4_ = fVar91;
            auVar89._20_4_ = fVar91;
            auVar89._24_4_ = fVar91;
            auVar89._28_4_ = fVar91;
            fVar116 = (ray->super_RayK<1>).tfar;
            auVar80 = vcmpps_avx(_local_720,auVar89,2);
            auVar80 = vandps_avx(auVar80,local_600);
          }
          auVar138._0_4_ = (float)local_620._0_4_ + local_480._0_4_;
          auVar138._4_4_ = (float)local_620._4_4_ + local_480._4_4_;
          auVar138._8_4_ = fStack_618 + local_480._8_4_;
          auVar138._12_4_ = fStack_614 + local_480._12_4_;
          auVar138._16_4_ = fStack_610 + local_480._16_4_;
          auVar138._20_4_ = fStack_60c + local_480._20_4_;
          auVar138._24_4_ = fStack_608 + local_480._24_4_;
          auVar138._28_4_ = fStack_604 + local_480._28_4_;
          auVar159._4_4_ = fVar116;
          auVar159._0_4_ = fVar116;
          auVar159._8_4_ = fVar116;
          auVar159._12_4_ = fVar116;
          auVar159._16_4_ = fVar116;
          auVar159._20_4_ = fVar116;
          auVar159._24_4_ = fVar116;
          auVar159._28_4_ = fVar116;
          auVar174 = vcmpps_avx(auVar138,auVar159,2);
          auVar80 = vandps_avx(local_560,local_540);
          auVar80 = vandps_avx(auVar174,auVar80);
          auVar183._0_4_ = (float)local_620._0_4_ + local_4c0._0_4_;
          auVar183._4_4_ = (float)local_620._4_4_ + local_4c0._4_4_;
          auVar183._8_4_ = fStack_618 + local_4c0._8_4_;
          auVar183._12_4_ = fStack_614 + local_4c0._12_4_;
          auVar183._16_4_ = fStack_610 + local_4c0._16_4_;
          auVar183._20_4_ = fStack_60c + local_4c0._20_4_;
          auVar183._24_4_ = fStack_608 + local_4c0._24_4_;
          auVar183._28_4_ = fStack_604 + local_4c0._28_4_;
          auVar230 = vcmpps_avx(auVar183,auVar159,2);
          auVar174 = vandps_avx(_local_760,local_740);
          auVar174 = vandps_avx(auVar230,auVar174);
          auVar174 = vorps_avx(auVar80,auVar174);
          if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar174 >> 0x7f,0) != '\0') ||
                (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar174 >> 0xbf,0) != '\0') ||
              (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar174[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar61 * 0x60) = auVar174;
            auVar80 = vblendvps_avx(_local_4c0,local_480,auVar80);
            *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x60) = auVar80;
            uVar60 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar61 * 0xc] = uVar60;
            aiStack_138[uVar61 * 0x18] = local_aec + 1;
            uVar61 = (ulong)((int)uVar61 + 1);
          }
          goto LAB_0118e207;
        }
      }
      auVar259 = ZEXT3264(local_a00);
      auVar245 = ZEXT3264(local_8a0);
      auVar242 = ZEXT3264(local_880);
      auVar222 = ZEXT3264(local_860);
    }
LAB_0118e207:
    auVar174 = local_360;
    fVar116 = (ray->super_RayK<1>).tfar;
    fVar91 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar91;
    auVar134._0_4_ = fVar91;
    auVar134._8_4_ = fVar91;
    auVar134._12_4_ = fVar91;
    auVar134._16_4_ = fVar91;
    auVar134._20_4_ = fVar91;
    auVar134._24_4_ = fVar91;
    auVar134._28_4_ = fVar91;
    while( true ) {
      uVar56 = (uint)uVar61;
      if (uVar56 == 0) {
        auVar79._4_4_ = fVar116;
        auVar79._0_4_ = fVar116;
        auVar79._8_4_ = fVar116;
        auVar79._12_4_ = fVar116;
        auVar7 = vcmpps_avx(local_4e0,auVar79,2);
        uVar57 = vmovmskps_avx(auVar7);
        uVar63 = (ulong)((uint)uVar63 & uVar57);
        goto LAB_0118d35c;
      }
      uVar60 = (ulong)(uVar56 - 1);
      lVar58 = uVar60 * 0x60;
      auVar80 = *(undefined1 (*) [32])(auStack_160 + lVar58);
      auVar111._0_4_ = auVar80._0_4_ + (float)local_620._0_4_;
      auVar111._4_4_ = auVar80._4_4_ + (float)local_620._4_4_;
      auVar111._8_4_ = auVar80._8_4_ + fStack_618;
      auVar111._12_4_ = auVar80._12_4_ + fStack_614;
      auVar111._16_4_ = auVar80._16_4_ + fStack_610;
      auVar111._20_4_ = auVar80._20_4_ + fStack_60c;
      auVar111._24_4_ = auVar80._24_4_ + fStack_608;
      auVar111._28_4_ = auVar80._28_4_ + fStack_604;
      auVar10 = vcmpps_avx(auVar111,auVar134,2);
      auVar230 = vandps_avx(auVar10,*(undefined1 (*) [32])(auStack_180 + lVar58));
      local_480 = auVar230;
      auVar10 = *(undefined1 (*) [32])(auStack_180 + lVar58) & auVar10;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') break;
      uVar61 = (ulong)(uVar56 - 1);
    }
    auVar83._8_4_ = 0x7f800000;
    auVar83._0_8_ = 0x7f8000007f800000;
    auVar83._12_4_ = 0x7f800000;
    auVar83._16_4_ = 0x7f800000;
    auVar83._20_4_ = 0x7f800000;
    auVar83._24_4_ = 0x7f800000;
    auVar83._28_4_ = 0x7f800000;
    auVar80 = vblendvps_avx(auVar83,auVar80,auVar230);
    auVar10 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar10 = vminps_avx(auVar80,auVar10);
    auVar11 = vshufpd_avx(auVar10,auVar10,5);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar11 = vpermpd_avx2(auVar10,0x4e);
    auVar10 = vminps_avx(auVar10,auVar11);
    auVar80 = vcmpps_avx(auVar80,auVar10,0);
    auVar10 = auVar230 & auVar80;
    if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0x7f,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar10 >> 0xbf,0) != '\0') ||
        (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar10[0x1f] < '\0')
    {
      auVar230 = vandps_avx(auVar80,auVar230);
    }
    uVar59 = vmovmskps_avx(auVar230);
    iVar12 = 0;
    for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
      iVar12 = iVar12 + 1;
    }
    *(undefined4 *)(local_480 + (uint)(iVar12 << 2)) = 0;
    uVar61 = (&uStack_140)[uVar60 * 0xc];
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar61;
    local_aec = aiStack_138[uVar60 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar58) = local_480;
    uVar59 = uVar56 - 1;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar59 = uVar56;
    }
    uVar62 = (undefined4)uVar61;
    auVar112._4_4_ = uVar62;
    auVar112._0_4_ = uVar62;
    auVar112._8_4_ = uVar62;
    auVar112._12_4_ = uVar62;
    auVar112._16_4_ = uVar62;
    auVar112._20_4_ = uVar62;
    auVar112._24_4_ = uVar62;
    auVar112._28_4_ = uVar62;
    auVar7 = vmovshdup_avx(auVar71);
    auVar7 = vsubps_avx(auVar7,auVar71);
    auVar84._0_4_ = auVar7._0_4_;
    auVar84._4_4_ = auVar84._0_4_;
    auVar84._8_4_ = auVar84._0_4_;
    auVar84._12_4_ = auVar84._0_4_;
    auVar84._16_4_ = auVar84._0_4_;
    auVar84._20_4_ = auVar84._0_4_;
    auVar84._24_4_ = auVar84._0_4_;
    auVar84._28_4_ = auVar84._0_4_;
    auVar7 = vfmadd132ps_fma(auVar84,auVar112,_DAT_01f7b040);
    _local_4c0 = ZEXT1632(auVar7);
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar12 << 2));
    uVar61 = (ulong)uVar59;
    uVar60 = local_800;
    auVar80 = auVar174;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }